

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  float *pfVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  byte bVar50;
  byte bVar51;
  ulong uVar52;
  byte bVar53;
  uint uVar54;
  byte bVar55;
  long lVar56;
  long lVar57;
  bool bVar58;
  undefined1 uVar59;
  undefined1 uVar60;
  ulong uVar61;
  uint uVar62;
  uint uVar123;
  uint uVar124;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar126;
  uint uVar127;
  uint uVar128;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  uint uVar125;
  uint uVar129;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined4 uVar130;
  vint4 bi_2;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar133 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar145;
  float fVar160;
  float fVar161;
  vint4 bi_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 bi;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  vint4 ai;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  vint4 ai_1;
  undefined1 auVar219 [16];
  undefined1 auVar222 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  vint4 ai_2;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar229 [64];
  undefined1 auVar230 [16];
  undefined1 auVar231 [28];
  undefined1 auVar232 [64];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [16];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_904;
  int local_8f4;
  ulong local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  RTCFilterFunctionNArguments local_758;
  uint local_728;
  uint local_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  undefined1 local_690 [16];
  undefined8 local_680;
  float local_678;
  float local_674;
  undefined4 local_670;
  uint local_66c;
  uint local_668;
  uint local_664;
  uint local_660;
  Primitive *local_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  ulong local_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  uVar52 = (ulong)(byte)prim[1];
  lVar57 = uVar52 * 0x25;
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 4 + 6)));
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 5 + 6)));
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 6 + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 0xf + 6)));
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 0x11 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 0x1a + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 0x1b + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 0x1c + 6)));
  auVar63 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar57 + 0x12)));
  auVar64 = vsubps_avx512vl((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                            *(undefined1 (*) [16])(prim + lVar57 + 6));
  fVar145 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar57 + 0x16)) *
            *(float *)(prim + lVar57 + 0x1a);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar52 * 7 + 6);
  auVar21 = vpmovsxwd_avx(auVar77);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar52 * 0xb + 6);
  auVar131 = vpmovsxwd_avx(auVar83);
  auVar65 = vpbroadcastd_avx512vl();
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar52 * 9 + 6);
  auVar147 = vpmovsxwd_avx(auVar79);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar52 * 0xd + 6);
  auVar66 = vpmovsxwd_avx512vl(auVar78);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar52 * 0x12 + 6);
  auVar85 = vpmovsxwd_avx(auVar85);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar52 * 0x16 + 6);
  auVar84 = vpmovsxwd_avx(auVar84);
  auVar64 = vmulps_avx512vl(auVar63,auVar64);
  auVar63 = vmulps_avx512vl(auVar63,(undefined1  [16])(ray->super_RayK<1>).dir.field_0);
  auVar67 = vcvtdq2ps_avx512vl(auVar73);
  auVar68 = vcvtdq2ps_avx512vl(auVar68);
  auVar69 = vcvtdq2ps_avx512vl(auVar69);
  auVar70 = vcvtdq2ps_avx512vl(auVar70);
  auVar71 = vcvtdq2ps_avx512vl(auVar71);
  auVar77 = vcvtdq2ps_avx(auVar72);
  auVar83 = vcvtdq2ps_avx(auVar74);
  auVar79 = vcvtdq2ps_avx(auVar75);
  auVar78 = vcvtdq2ps_avx(auVar76);
  auVar72 = vbroadcastss_avx512vl(auVar63);
  auVar73 = vshufps_avx512vl(auVar63,auVar63,0x55);
  auVar74 = vshufps_avx512vl(auVar63,auVar63,0xaa);
  auVar75 = vmulps_avx512vl(auVar74,auVar69);
  auVar146._0_4_ = auVar74._0_4_ * auVar77._0_4_;
  auVar146._4_4_ = auVar74._4_4_ * auVar77._4_4_;
  auVar146._8_4_ = auVar74._8_4_ * auVar77._8_4_;
  auVar146._12_4_ = auVar74._12_4_ * auVar77._12_4_;
  auVar63._0_4_ = auVar78._0_4_ * auVar74._0_4_;
  auVar63._4_4_ = auVar78._4_4_ * auVar74._4_4_;
  auVar63._8_4_ = auVar78._8_4_ * auVar74._8_4_;
  auVar63._12_4_ = auVar78._12_4_ * auVar74._12_4_;
  auVar74 = vfmadd231ps_avx512vl(auVar75,auVar73,auVar68);
  auVar75 = vfmadd231ps_avx512vl(auVar146,auVar73,auVar71);
  auVar73 = vfmadd231ps_fma(auVar63,auVar79,auVar73);
  auVar74 = vfmadd231ps_avx512vl(auVar74,auVar72,auVar67);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar72,auVar70);
  auVar73 = vfmadd231ps_fma(auVar73,auVar83,auVar72);
  auVar72 = vbroadcastss_avx512vl(auVar64);
  auVar76 = vshufps_avx512vl(auVar64,auVar64,0x55);
  auVar63 = vshufps_avx512vl(auVar64,auVar64,0xaa);
  auVar69 = vmulps_avx512vl(auVar63,auVar69);
  auVar77 = vmulps_avx512vl(auVar63,auVar77);
  auVar78 = vmulps_avx512vl(auVar63,auVar78);
  auVar68 = vfmadd231ps_avx512vl(auVar69,auVar76,auVar68);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar76,auVar71);
  auVar79 = vfmadd231ps_avx512vl(auVar78,auVar76,auVar79);
  auVar64 = vfmadd231ps_avx512vl(auVar68,auVar72,auVar67);
  auVar67 = vfmadd231ps_avx512vl(auVar77,auVar72,auVar70);
  auVar63 = vfmadd231ps_fma(auVar79,auVar72,auVar83);
  auVar237._8_4_ = 0x7fffffff;
  auVar237._0_8_ = 0x7fffffff7fffffff;
  auVar237._12_4_ = 0x7fffffff;
  auVar77 = vandps_avx(auVar237,auVar74);
  auVar233._8_4_ = 0x219392ef;
  auVar233._0_8_ = 0x219392ef219392ef;
  auVar233._12_4_ = 0x219392ef;
  uVar61 = vcmpps_avx512vl(auVar77,auVar233,1);
  bVar58 = (bool)((byte)uVar61 & 1);
  auVar80._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar74._0_4_;
  bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar74._4_4_;
  bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar74._8_4_;
  bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar74._12_4_;
  auVar77 = vandps_avx(auVar237,auVar75);
  uVar61 = vcmpps_avx512vl(auVar77,auVar233,1);
  bVar58 = (bool)((byte)uVar61 & 1);
  auVar81._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar75._0_4_;
  bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar75._4_4_;
  bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar75._8_4_;
  bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar75._12_4_;
  auVar77 = vandps_avx(auVar237,auVar73);
  uVar61 = vcmpps_avx512vl(auVar77,auVar233,1);
  bVar58 = (bool)((byte)uVar61 & 1);
  auVar82._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar73._0_4_;
  bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar73._4_4_;
  bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar73._8_4_;
  bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * auVar73._12_4_;
  auVar83 = vrcp14ps_avx512vl(auVar80);
  auVar234._8_4_ = 0x3f800000;
  auVar234._0_8_ = 0x3f8000003f800000;
  auVar234._12_4_ = 0x3f800000;
  auVar77 = vfnmadd213ps_fma(auVar80,auVar83,auVar234);
  auVar79 = vfmadd132ps_fma(auVar77,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar81);
  auVar77 = vfnmadd213ps_fma(auVar81,auVar83,auVar234);
  auVar78 = vfmadd132ps_fma(auVar77,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar82);
  auVar77 = vfnmadd213ps_fma(auVar82,auVar83,auVar234);
  auVar74 = vfmadd132ps_fma(auVar77,auVar83,auVar83);
  auVar210._4_4_ = fVar145;
  auVar210._0_4_ = fVar145;
  auVar210._8_4_ = fVar145;
  auVar210._12_4_ = fVar145;
  auVar77 = vcvtdq2ps_avx(auVar21);
  auVar83 = vcvtdq2ps_avx(auVar131);
  auVar83 = vsubps_avx(auVar83,auVar77);
  auVar75 = vfmadd213ps_fma(auVar83,auVar210,auVar77);
  auVar77 = vcvtdq2ps_avx(auVar147);
  auVar83 = vcvtdq2ps_avx512vl(auVar66);
  auVar83 = vsubps_avx(auVar83,auVar77);
  auVar76 = vfmadd213ps_fma(auVar83,auVar210,auVar77);
  auVar77 = vcvtdq2ps_avx(auVar85);
  auVar83 = vcvtdq2ps_avx(auVar84);
  auVar83 = vsubps_avx(auVar83,auVar77);
  auVar85 = vfmadd213ps_fma(auVar83,auVar210,auVar77);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar52 * 0x14 + 6);
  auVar77 = vpmovsxwd_avx(auVar73);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar52 * 0x18 + 6);
  auVar83 = vpmovsxwd_avx(auVar68);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar77);
  auVar84 = vfmadd213ps_fma(auVar83,auVar210,auVar77);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar52 * 0x1d + 6);
  auVar77 = vpmovsxwd_avx(auVar69);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar52 * 0x21 + 6);
  auVar83 = vpmovsxwd_avx(auVar70);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar77);
  auVar73 = vfmadd213ps_fma(auVar83,auVar210,auVar77);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar52 * 0x1f + 6);
  auVar77 = vpmovsxwd_avx(auVar71);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar52 * 0x23 + 6);
  auVar83 = vpmovsxwd_avx(auVar72);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar77);
  auVar83 = vfmadd213ps_fma(auVar83,auVar210,auVar77);
  auVar77 = vsubps_avx512vl(auVar75,auVar64);
  auVar66._0_4_ = auVar79._0_4_ * auVar77._0_4_;
  auVar66._4_4_ = auVar79._4_4_ * auVar77._4_4_;
  auVar66._8_4_ = auVar79._8_4_ * auVar77._8_4_;
  auVar66._12_4_ = auVar79._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx512vl(auVar76,auVar64);
  auVar64._0_4_ = auVar79._0_4_ * auVar77._0_4_;
  auVar64._4_4_ = auVar79._4_4_ * auVar77._4_4_;
  auVar64._8_4_ = auVar79._8_4_ * auVar77._8_4_;
  auVar64._12_4_ = auVar79._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar85,auVar67);
  auVar219._0_4_ = auVar78._0_4_ * auVar77._0_4_;
  auVar219._4_4_ = auVar78._4_4_ * auVar77._4_4_;
  auVar219._8_4_ = auVar78._8_4_ * auVar77._8_4_;
  auVar219._12_4_ = auVar78._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar84,auVar67);
  auVar147._0_4_ = auVar78._0_4_ * auVar77._0_4_;
  auVar147._4_4_ = auVar78._4_4_ * auVar77._4_4_;
  auVar147._8_4_ = auVar78._8_4_ * auVar77._8_4_;
  auVar147._12_4_ = auVar78._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar73,auVar63);
  auVar67._0_4_ = auVar74._0_4_ * auVar77._0_4_;
  auVar67._4_4_ = auVar74._4_4_ * auVar77._4_4_;
  auVar67._8_4_ = auVar74._8_4_ * auVar77._8_4_;
  auVar67._12_4_ = auVar74._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar83,auVar63);
  auVar131._0_4_ = auVar74._0_4_ * auVar77._0_4_;
  auVar131._4_4_ = auVar74._4_4_ * auVar77._4_4_;
  auVar131._8_4_ = auVar74._8_4_ * auVar77._8_4_;
  auVar131._12_4_ = auVar74._12_4_ * auVar77._12_4_;
  auVar77 = vpminsd_avx(auVar66,auVar64);
  auVar83 = vpminsd_avx(auVar219,auVar147);
  auVar77 = vmaxps_avx(auVar77,auVar83);
  auVar83 = vpminsd_avx(auVar67,auVar131);
  uVar130 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar74._4_4_ = uVar130;
  auVar74._0_4_ = uVar130;
  auVar74._8_4_ = uVar130;
  auVar74._12_4_ = uVar130;
  auVar83 = vmaxps_avx512vl(auVar83,auVar74);
  auVar77 = vmaxps_avx(auVar77,auVar83);
  auVar75._8_4_ = 0x3f7ffffa;
  auVar75._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar75._12_4_ = 0x3f7ffffa;
  local_2e0 = vmulps_avx512vl(auVar77,auVar75);
  auVar77 = vpmaxsd_avx(auVar66,auVar64);
  auVar83 = vpmaxsd_avx(auVar219,auVar147);
  auVar77 = vminps_avx(auVar77,auVar83);
  auVar83 = vpmaxsd_avx(auVar67,auVar131);
  fVar145 = (ray->super_RayK<1>).tfar;
  auVar76._4_4_ = fVar145;
  auVar76._0_4_ = fVar145;
  auVar76._8_4_ = fVar145;
  auVar76._12_4_ = fVar145;
  auVar83 = vminps_avx512vl(auVar83,auVar76);
  auVar77 = vminps_avx(auVar77,auVar83);
  auVar21._8_4_ = 0x3f800003;
  auVar21._0_8_ = 0x3f8000033f800003;
  auVar21._12_4_ = 0x3f800003;
  auVar77 = vmulps_avx512vl(auVar77,auVar21);
  uVar22 = vcmpps_avx512vl(local_2e0,auVar77,2);
  uVar24 = vpcmpgtd_avx512vl(auVar65,_DAT_01f4ad30);
  uVar61 = CONCAT44((int)((ulong)prim >> 0x20),(uint)((byte)uVar22 & 0xf & (byte)uVar24));
  local_648 = prim;
LAB_018916e0:
  auVar89._8_4_ = 0x7fffffff;
  auVar89._0_8_ = 0x7fffffff7fffffff;
  auVar89._12_4_ = 0x7fffffff;
  auVar89._16_4_ = 0x7fffffff;
  auVar89._20_4_ = 0x7fffffff;
  auVar89._24_4_ = 0x7fffffff;
  auVar89._28_4_ = 0x7fffffff;
  if (uVar61 == 0) {
    return;
  }
  local_4e8 = uVar61;
  lVar57 = 0;
  for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    lVar57 = lVar57 + 1;
  }
  local_8f0 = (ulong)*(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_8e8 = (ulong)*(uint *)(prim + lVar57 * 4 + 6);
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar57 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar145 = (pGVar8->time_range).lower;
  fVar145 = pGVar8->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar145) /
            ((pGVar8->time_range).upper - fVar145));
  auVar77 = vroundss_avx(ZEXT416((uint)fVar145),ZEXT416((uint)fVar145),9);
  auVar77 = vminss_avx(auVar77,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar77 = vmaxss_avx(ZEXT816(0) << 0x20,auVar77);
  fVar145 = fVar145 - auVar77._0_4_;
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar56 = (long)(int)auVar77._0_4_ * 0x38;
  lVar57 = *(long *)(_Var9 + 0x10 + lVar56);
  lVar10 = *(long *)(_Var9 + 0x38 + lVar56);
  lVar11 = *(long *)(_Var9 + 0x48 + lVar56);
  pfVar5 = (float *)(lVar10 + uVar61 * lVar11);
  auVar167._0_4_ = fVar145 * *pfVar5;
  auVar167._4_4_ = fVar145 * pfVar5[1];
  auVar167._8_4_ = fVar145 * pfVar5[2];
  auVar167._12_4_ = fVar145 * pfVar5[3];
  pfVar5 = (float *)(lVar10 + (uVar61 + 1) * lVar11);
  auVar186._0_4_ = fVar145 * *pfVar5;
  auVar186._4_4_ = fVar145 * pfVar5[1];
  auVar186._8_4_ = fVar145 * pfVar5[2];
  auVar186._12_4_ = fVar145 * pfVar5[3];
  pfVar5 = (float *)(lVar10 + (uVar61 + 2) * lVar11);
  auVar203._0_4_ = fVar145 * *pfVar5;
  auVar203._4_4_ = fVar145 * pfVar5[1];
  auVar203._8_4_ = fVar145 * pfVar5[2];
  auVar203._12_4_ = fVar145 * pfVar5[3];
  pfVar5 = (float *)(lVar10 + lVar11 * (uVar61 + 3));
  auVar148._0_4_ = fVar145 * *pfVar5;
  auVar148._4_4_ = fVar145 * pfVar5[1];
  auVar148._8_4_ = fVar145 * pfVar5[2];
  auVar148._12_4_ = fVar145 * pfVar5[3];
  lVar10 = *(long *)(_Var9 + lVar56);
  fVar145 = 1.0 - fVar145;
  auVar132._4_4_ = fVar145;
  auVar132._0_4_ = fVar145;
  auVar132._8_4_ = fVar145;
  auVar132._12_4_ = fVar145;
  auVar79 = vfmadd231ps_fma(auVar167,auVar132,*(undefined1 (*) [16])(lVar10 + lVar57 * uVar61));
  auVar78 = vfmadd231ps_fma(auVar186,auVar132,*(undefined1 (*) [16])(lVar10 + lVar57 * (uVar61 + 1))
                           );
  auVar85 = vfmadd231ps_fma(auVar203,auVar132,*(undefined1 (*) [16])(lVar10 + lVar57 * (uVar61 + 2))
                           );
  auVar84 = vfmadd231ps_fma(auVar148,auVar132,*(undefined1 (*) [16])(lVar10 + lVar57 * (uVar61 + 3))
                           );
  auVar211._0_4_ = auVar79._0_4_ + auVar78._0_4_ + auVar85._0_4_ + auVar84._0_4_;
  auVar211._4_4_ = auVar79._4_4_ + auVar78._4_4_ + auVar85._4_4_ + auVar84._4_4_;
  auVar211._8_4_ = auVar79._8_4_ + auVar78._8_4_ + auVar85._8_4_ + auVar84._8_4_;
  auVar211._12_4_ = auVar79._12_4_ + auVar78._12_4_ + auVar85._12_4_ + auVar84._12_4_;
  aVar6 = (ray->super_RayK<1>).org.field_0;
  aVar7 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar65._8_4_ = 0x3e800000;
  auVar65._0_8_ = 0x3e8000003e800000;
  auVar65._12_4_ = 0x3e800000;
  auVar77 = vmulps_avx512vl(auVar211,auVar65);
  auVar77 = vsubps_avx(auVar77,(undefined1  [16])aVar6);
  auVar77 = vdpps_avx(auVar77,(undefined1  [16])aVar7,0x7f);
  auVar83 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
  auVar230._4_12_ = ZEXT812(0) << 0x20;
  auVar230._0_4_ = auVar83._0_4_;
  auVar73 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar230);
  auVar83 = vfnmadd213ss_fma(auVar73,auVar83,ZEXT416(0x40000000));
  fVar145 = auVar77._0_4_ * auVar73._0_4_ * auVar83._0_4_;
  local_540 = ZEXT416((uint)fVar145);
  auVar212._4_4_ = fVar145;
  auVar212._0_4_ = fVar145;
  auVar212._8_4_ = fVar145;
  auVar212._12_4_ = fVar145;
  fStack_330 = fVar145;
  _local_340 = auVar212;
  fStack_32c = fVar145;
  fStack_328 = fVar145;
  fStack_324 = fVar145;
  auVar77 = vfmadd231ps_fma((undefined1  [16])aVar6,(undefined1  [16])aVar7,auVar212);
  auVar77 = vblendps_avx(auVar77,ZEXT816(0) << 0x40,8);
  auVar83 = vsubps_avx(auVar79,auVar77);
  auVar79 = vsubps_avx(auVar85,auVar77);
  auVar86 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[0]));
  auVar251 = ZEXT3264(auVar86);
  local_6e0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
  auVar248 = ZEXT3264(local_6e0);
  local_7a0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]));
  auVar250 = ZEXT3264(local_7a0);
  auVar78 = vsubps_avx(auVar78,auVar77);
  auVar77 = vsubps_avx(auVar84,auVar77);
  uVar130 = auVar83._0_4_;
  local_600._4_4_ = uVar130;
  local_600._0_4_ = uVar130;
  local_600._8_4_ = uVar130;
  local_600._12_4_ = uVar130;
  local_600._16_4_ = uVar130;
  local_600._20_4_ = uVar130;
  local_600._24_4_ = uVar130;
  local_600._28_4_ = uVar130;
  auVar232 = ZEXT3264(local_600);
  auVar87._8_4_ = 1;
  auVar87._0_8_ = 0x100000001;
  auVar87._12_4_ = 1;
  auVar87._16_4_ = 1;
  auVar87._20_4_ = 1;
  auVar87._24_4_ = 1;
  auVar87._28_4_ = 1;
  local_420 = ZEXT1632(auVar83);
  local_620 = vpermps_avx2(auVar87,local_420);
  auVar236 = ZEXT3264(local_620);
  auVar90._8_4_ = 2;
  auVar90._0_8_ = 0x200000002;
  auVar90._12_4_ = 2;
  auVar90._16_4_ = 2;
  auVar90._20_4_ = 2;
  auVar90._24_4_ = 2;
  auVar90._28_4_ = 2;
  local_5c0 = vpermps_avx2(auVar90,local_420);
  auVar91._8_4_ = 3;
  auVar91._0_8_ = 0x300000003;
  auVar91._12_4_ = 3;
  auVar91._16_4_ = 3;
  auVar91._20_4_ = 3;
  auVar91._24_4_ = 3;
  auVar91._28_4_ = 3;
  local_640 = vpermps_avx2(auVar91,local_420);
  uVar130 = auVar78._0_4_;
  local_4e0._4_4_ = uVar130;
  local_4e0._0_4_ = uVar130;
  local_4e0._8_4_ = uVar130;
  local_4e0._12_4_ = uVar130;
  local_4e0._16_4_ = uVar130;
  local_4e0._20_4_ = uVar130;
  local_4e0._24_4_ = uVar130;
  local_4e0._28_4_ = uVar130;
  local_460 = ZEXT1632(auVar78);
  local_4c0 = vpermps_avx2(auVar87,local_460);
  local_7c0 = vpermps_avx512vl(auVar90,local_460);
  auVar253 = ZEXT3264(local_7c0);
  local_7e0 = vpermps_avx2(auVar91,local_460);
  auVar241 = ZEXT3264(local_7e0);
  auVar229 = ZEXT3264(local_5c0);
  local_800 = vbroadcastss_avx512vl(auVar79);
  auVar242 = ZEXT3264(local_800);
  local_440 = ZEXT1632(auVar79);
  local_820 = vpermps_avx512vl(auVar87,local_440);
  auVar243 = ZEXT3264(local_820);
  local_840 = vpermps_avx512vl(auVar90,local_440);
  auVar244 = ZEXT3264(local_840);
  local_860 = vpermps_avx512vl(auVar91,local_440);
  auVar245 = ZEXT3264(local_860);
  auVar209 = ZEXT3264(local_4e0);
  local_880 = vbroadcastss_avx512vl(auVar77);
  auVar246 = ZEXT3264(local_880);
  _local_480 = ZEXT1632(auVar77);
  local_8a0 = vpermps_avx512vl(auVar87,_local_480);
  auVar247 = ZEXT3264(local_8a0);
  local_8c0 = vpermps_avx512vl(auVar90,_local_480);
  auVar249 = ZEXT3264(local_8c0);
  local_720 = vpermps_avx512vl(auVar91,_local_480);
  auVar252 = ZEXT3264(local_720);
  auVar87 = vpermps_avx2(auVar90,ZEXT1632(CONCAT412(aVar7.field_3.w * aVar7.field_3.w,
                                                    CONCAT48(aVar7.z * aVar7.z,
                                                             CONCAT44(aVar7.y * aVar7.y,
                                                                      aVar7.x * aVar7.x)))));
  auVar87 = vfmadd231ps_avx512vl(auVar87,local_6e0,local_6e0);
  local_1e0 = vfmadd231ps_avx512vl(auVar87,auVar86,auVar86);
  local_200 = vandps_avx(auVar89,local_1e0);
  auVar239 = ZEXT3264(local_640);
  auVar223 = ZEXT3264(local_4c0);
  uVar54 = 0;
  local_904 = 1;
  local_2d0 = ZEXT816(0x3f80000000000000);
  do {
    auVar77 = vmovshdup_avx(local_2d0);
    auVar77 = vsubps_avx(auVar77,local_2d0);
    fVar145 = auVar77._0_4_;
    fVar164 = fVar145 * 0.04761905;
    local_8e0._0_4_ = local_2d0._0_4_;
    local_8e0._4_4_ = local_8e0._0_4_;
    fStack_8d8 = (float)local_8e0._0_4_;
    fStack_8d4 = (float)local_8e0._0_4_;
    register0x000012d0 = local_8e0._0_4_;
    register0x000012d4 = local_8e0._0_4_;
    register0x000012d8 = local_8e0._0_4_;
    register0x000012dc = local_8e0._0_4_;
    auVar213._4_4_ = fVar145;
    auVar213._0_4_ = fVar145;
    auVar213._8_4_ = fVar145;
    auVar213._12_4_ = fVar145;
    local_6c0._16_4_ = fVar145;
    local_6c0._0_16_ = auVar213;
    local_6c0._20_4_ = fVar145;
    local_6c0._24_4_ = fVar145;
    local_6c0._28_4_ = fVar145;
    auVar77 = vfmadd231ps_fma(_local_8e0,local_6c0,_DAT_01f7b040);
    auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar89 = vsubps_avx512vl(auVar88,ZEXT1632(auVar77));
    fVar145 = auVar77._0_4_;
    fVar160 = auVar77._4_4_;
    auVar99._4_4_ = auVar209._4_4_ * fVar160;
    auVar99._0_4_ = auVar209._0_4_ * fVar145;
    fVar161 = auVar77._8_4_;
    auVar99._8_4_ = auVar209._8_4_ * fVar161;
    fVar162 = auVar77._12_4_;
    auVar99._12_4_ = auVar209._12_4_ * fVar162;
    auVar99._16_4_ = auVar209._16_4_ * 0.0;
    auVar99._20_4_ = auVar209._20_4_ * 0.0;
    auVar99._24_4_ = auVar209._24_4_ * 0.0;
    auVar99._28_4_ = DAT_01f7b040._28_4_;
    auVar92._4_4_ = auVar223._4_4_ * fVar160;
    auVar92._0_4_ = auVar223._0_4_ * fVar145;
    auVar92._8_4_ = auVar223._8_4_ * fVar161;
    auVar92._12_4_ = auVar223._12_4_ * fVar162;
    auVar92._16_4_ = auVar223._16_4_ * 0.0;
    auVar92._20_4_ = auVar223._20_4_ * 0.0;
    auVar92._24_4_ = auVar223._24_4_ * 0.0;
    auVar92._28_4_ = local_8e0._0_4_;
    auVar87 = vmulps_avx512vl(auVar253._0_32_,ZEXT1632(auVar77));
    auVar224._0_4_ = auVar241._0_4_ * fVar145;
    auVar224._4_4_ = auVar241._4_4_ * fVar160;
    auVar224._8_4_ = auVar241._8_4_ * fVar161;
    auVar224._12_4_ = auVar241._12_4_ * fVar162;
    auVar224._16_4_ = auVar241._16_4_ * 0.0;
    auVar224._20_4_ = auVar241._20_4_ * 0.0;
    auVar224._28_36_ = auVar223._28_36_;
    auVar224._24_4_ = auVar241._24_4_ * 0.0;
    auVar83 = vfmadd231ps_fma(auVar99,auVar89,auVar232._0_32_);
    auVar79 = vfmadd231ps_fma(auVar92,auVar89,auVar236._0_32_);
    auVar78 = vfmadd231ps_fma(auVar87,auVar89,auVar229._0_32_);
    auVar85 = vfmadd231ps_fma(auVar224._0_32_,auVar89,auVar239._0_32_);
    auVar87 = vmulps_avx512vl(auVar242._0_32_,ZEXT1632(auVar77));
    auVar93 = ZEXT1632(auVar77);
    auVar86 = vmulps_avx512vl(auVar243._0_32_,auVar93);
    auVar90 = vmulps_avx512vl(auVar244._0_32_,auVar93);
    auVar91 = vmulps_avx512vl(auVar245._0_32_,auVar93);
    auVar84 = vfmadd231ps_fma(auVar87,auVar89,auVar209._0_32_);
    auVar73 = vfmadd231ps_fma(auVar86,auVar89,auVar223._0_32_);
    auVar87 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar253._0_32_);
    auVar68 = vfmadd231ps_fma(auVar91,auVar89,auVar241._0_32_);
    auVar86 = vmulps_avx512vl(auVar246._0_32_,auVar93);
    auVar90 = vmulps_avx512vl(auVar247._0_32_,auVar93);
    auVar91 = vmulps_avx512vl(auVar249._0_32_,auVar93);
    auVar92 = vmulps_avx512vl(auVar252._0_32_,auVar93);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar89,auVar242._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar243._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar89,auVar244._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar245._0_32_);
    auVar209._28_36_ = auVar241._28_36_;
    auVar209._0_28_ =
         ZEXT1628(CONCAT412(fVar162 * auVar84._12_4_,
                            CONCAT48(fVar161 * auVar84._8_4_,
                                     CONCAT44(fVar160 * auVar84._4_4_,fVar145 * auVar84._0_4_))));
    auVar93 = vmulps_avx512vl(auVar93,ZEXT1632(auVar73));
    auVar94 = vmulps_avx512vl(ZEXT1632(auVar77),auVar87);
    auVar95 = vmulps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar68));
    auVar77 = vfmadd231ps_fma(auVar209._0_32_,auVar89,ZEXT1632(auVar83));
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,ZEXT1632(auVar79));
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar78));
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar89,ZEXT1632(auVar85));
    auVar100._0_4_ = auVar86._0_4_ * fVar145;
    auVar100._4_4_ = auVar86._4_4_ * fVar160;
    auVar100._8_4_ = auVar86._8_4_ * fVar161;
    auVar100._12_4_ = auVar86._12_4_ * fVar162;
    auVar100._16_4_ = auVar86._16_4_ * 0.0;
    auVar100._20_4_ = auVar86._20_4_ * 0.0;
    auVar100._24_4_ = auVar86._24_4_ * 0.0;
    auVar100._28_4_ = 0;
    auVar96._4_4_ = auVar90._4_4_ * fVar160;
    auVar96._0_4_ = auVar90._0_4_ * fVar145;
    auVar96._8_4_ = auVar90._8_4_ * fVar161;
    auVar96._12_4_ = auVar90._12_4_ * fVar162;
    auVar96._16_4_ = auVar90._16_4_ * 0.0;
    auVar96._20_4_ = auVar90._20_4_ * 0.0;
    auVar96._24_4_ = auVar90._24_4_ * 0.0;
    auVar96._28_4_ = auVar86._28_4_;
    auVar97._4_4_ = auVar91._4_4_ * fVar160;
    auVar97._0_4_ = auVar91._0_4_ * fVar145;
    auVar97._8_4_ = auVar91._8_4_ * fVar161;
    auVar97._12_4_ = auVar91._12_4_ * fVar162;
    auVar97._16_4_ = auVar91._16_4_ * 0.0;
    auVar97._20_4_ = auVar91._20_4_ * 0.0;
    auVar97._24_4_ = auVar91._24_4_ * 0.0;
    auVar97._28_4_ = auVar90._28_4_;
    auVar98._4_4_ = auVar92._4_4_ * fVar160;
    auVar98._0_4_ = auVar92._0_4_ * fVar145;
    auVar98._8_4_ = auVar92._8_4_ * fVar161;
    auVar98._12_4_ = auVar92._12_4_ * fVar162;
    auVar98._16_4_ = auVar92._16_4_ * 0.0;
    auVar98._20_4_ = auVar92._20_4_ * 0.0;
    auVar98._24_4_ = auVar92._24_4_ * 0.0;
    auVar98._28_4_ = auVar91._28_4_;
    auVar83 = vfmadd231ps_fma(auVar100,auVar89,ZEXT1632(auVar84));
    auVar79 = vfmadd231ps_fma(auVar96,auVar89,ZEXT1632(auVar73));
    auVar78 = vfmadd231ps_fma(auVar97,auVar89,auVar87);
    auVar85 = vfmadd231ps_fma(auVar98,auVar89,ZEXT1632(auVar68));
    auVar84 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar162 * auVar83._12_4_,
                                                 CONCAT48(fVar161 * auVar83._8_4_,
                                                          CONCAT44(fVar160 * auVar83._4_4_,
                                                                   fVar145 * auVar83._0_4_)))),
                              auVar89,ZEXT1632(auVar77));
    auVar96 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar79._12_4_ * fVar162,
                                            CONCAT48(auVar79._8_4_ * fVar161,
                                                     CONCAT44(auVar79._4_4_ * fVar160,
                                                              auVar79._0_4_ * fVar145)))),auVar89,
                         auVar93);
    auVar97 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar78._12_4_ * fVar162,
                                            CONCAT48(auVar78._8_4_ * fVar161,
                                                     CONCAT44(auVar78._4_4_ * fVar160,
                                                              auVar78._0_4_ * fVar145)))),auVar89,
                         auVar94);
    auVar86 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar85._12_4_ * fVar162,
                                            CONCAT48(auVar85._8_4_ * fVar161,
                                                     CONCAT44(auVar85._4_4_ * fVar160,
                                                              auVar85._0_4_ * fVar145)))),auVar95,
                         auVar89);
    auVar89 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar77));
    auVar87 = vsubps_avx512vl(ZEXT1632(auVar79),auVar93);
    auVar90 = vsubps_avx512vl(ZEXT1632(auVar78),auVar94);
    auVar91 = vsubps_avx512vl(ZEXT1632(auVar85),auVar95);
    auVar113._0_4_ = fVar164 * auVar89._0_4_ * 3.0;
    auVar113._4_4_ = fVar164 * auVar89._4_4_ * 3.0;
    auVar113._8_4_ = fVar164 * auVar89._8_4_ * 3.0;
    auVar113._12_4_ = fVar164 * auVar89._12_4_ * 3.0;
    auVar113._16_4_ = fVar164 * auVar89._16_4_ * 3.0;
    auVar113._20_4_ = fVar164 * auVar89._20_4_ * 3.0;
    auVar113._24_4_ = fVar164 * auVar89._24_4_ * 3.0;
    auVar113._28_4_ = 0;
    auVar114._0_4_ = fVar164 * auVar87._0_4_ * 3.0;
    auVar114._4_4_ = fVar164 * auVar87._4_4_ * 3.0;
    auVar114._8_4_ = fVar164 * auVar87._8_4_ * 3.0;
    auVar114._12_4_ = fVar164 * auVar87._12_4_ * 3.0;
    auVar114._16_4_ = fVar164 * auVar87._16_4_ * 3.0;
    auVar114._20_4_ = fVar164 * auVar87._20_4_ * 3.0;
    auVar114._24_4_ = fVar164 * auVar87._24_4_ * 3.0;
    auVar114._28_4_ = 0;
    auVar115._0_4_ = fVar164 * auVar90._0_4_ * 3.0;
    auVar115._4_4_ = fVar164 * auVar90._4_4_ * 3.0;
    auVar115._8_4_ = fVar164 * auVar90._8_4_ * 3.0;
    auVar115._12_4_ = fVar164 * auVar90._12_4_ * 3.0;
    auVar115._16_4_ = fVar164 * auVar90._16_4_ * 3.0;
    auVar115._20_4_ = fVar164 * auVar90._20_4_ * 3.0;
    auVar115._24_4_ = fVar164 * auVar90._24_4_ * 3.0;
    auVar115._28_4_ = 0;
    fVar145 = auVar91._0_4_ * 3.0 * fVar164;
    fVar160 = auVar91._4_4_ * 3.0 * fVar164;
    auVar105._4_4_ = fVar160;
    auVar105._0_4_ = fVar145;
    fVar161 = auVar91._8_4_ * 3.0 * fVar164;
    auVar105._8_4_ = fVar161;
    fVar162 = auVar91._12_4_ * 3.0 * fVar164;
    auVar105._12_4_ = fVar162;
    fVar163 = auVar91._16_4_ * 3.0 * fVar164;
    auVar105._16_4_ = fVar163;
    fVar165 = auVar91._20_4_ * 3.0 * fVar164;
    auVar105._20_4_ = fVar165;
    fVar166 = auVar91._24_4_ * 3.0 * fVar164;
    auVar105._24_4_ = fVar166;
    auVar105._28_4_ = fVar164;
    auVar77 = vxorps_avx512vl(auVar253._0_16_,auVar253._0_16_);
    auVar98 = vpermt2ps_avx512vl(ZEXT1632(auVar84),_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar99 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar90 = ZEXT1632(auVar77);
    auVar100 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar90);
    auVar101._0_4_ = auVar86._0_4_ + fVar145;
    auVar101._4_4_ = auVar86._4_4_ + fVar160;
    auVar101._8_4_ = auVar86._8_4_ + fVar161;
    auVar101._12_4_ = auVar86._12_4_ + fVar162;
    auVar101._16_4_ = auVar86._16_4_ + fVar163;
    auVar101._20_4_ = auVar86._20_4_ + fVar165;
    auVar101._24_4_ = auVar86._24_4_ + fVar166;
    auVar101._28_4_ = auVar86._28_4_ + fVar164;
    auVar89 = vmaxps_avx(auVar86,auVar101);
    auVar87 = vminps_avx(auVar86,auVar101);
    auVar93 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,auVar90);
    auVar101 = vpermt2ps_avx512vl(auVar113,_DAT_01fb9fc0,auVar90);
    auVar102 = vpermt2ps_avx512vl(auVar114,_DAT_01fb9fc0,auVar90);
    auVar121 = ZEXT1632(auVar77);
    auVar103 = vpermt2ps_avx512vl(auVar115,_DAT_01fb9fc0,auVar121);
    auVar86 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,auVar121);
    auVar86 = vsubps_avx(auVar93,auVar86);
    auVar90 = vsubps_avx(auVar98,ZEXT1632(auVar84));
    auVar91 = vsubps_avx(auVar99,auVar96);
    auVar92 = vsubps_avx(auVar100,auVar97);
    auVar94 = vmulps_avx512vl(auVar91,auVar115);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar114,auVar92);
    auVar95 = vmulps_avx512vl(auVar92,auVar113);
    auVar95 = vfmsub231ps_avx512vl(auVar95,auVar115,auVar90);
    auVar104 = vmulps_avx512vl(auVar90,auVar114);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar113,auVar91);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar95 = vfmadd231ps_avx512vl(auVar104,auVar95,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar94);
    auVar95 = vmulps_avx512vl(auVar92,auVar92);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar91);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,auVar90);
    auVar104 = vrcp14ps_avx512vl(auVar95);
    auVar105 = vfnmadd213ps_avx512vl(auVar104,auVar95,auVar88);
    auVar104 = vfmadd132ps_avx512vl(auVar105,auVar104,auVar104);
    auVar94 = vmulps_avx512vl(auVar94,auVar104);
    auVar105 = vmulps_avx512vl(auVar91,auVar103);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar102,auVar92);
    auVar106 = vmulps_avx512vl(auVar92,auVar101);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar103,auVar90);
    auVar107 = vmulps_avx512vl(auVar90,auVar102);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar101,auVar91);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar104 = vmulps_avx512vl(auVar105,auVar104);
    auVar94 = vmaxps_avx512vl(auVar94,auVar104);
    auVar94 = vsqrtps_avx512vl(auVar94);
    auVar104 = vmaxps_avx512vl(auVar86,auVar93);
    auVar89 = vmaxps_avx512vl(auVar89,auVar104);
    auVar104 = vaddps_avx512vl(auVar94,auVar89);
    auVar89 = vminps_avx(auVar86,auVar93);
    auVar89 = vminps_avx(auVar87,auVar89);
    auVar89 = vsubps_avx512vl(auVar89,auVar94);
    auVar86._8_4_ = 0x3f800002;
    auVar86._0_8_ = 0x3f8000023f800002;
    auVar86._12_4_ = 0x3f800002;
    auVar86._16_4_ = 0x3f800002;
    auVar86._20_4_ = 0x3f800002;
    auVar86._24_4_ = 0x3f800002;
    auVar86._28_4_ = 0x3f800002;
    auVar87 = vmulps_avx512vl(auVar104,auVar86);
    auVar93._8_4_ = 0x3f7ffffc;
    auVar93._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar93._12_4_ = 0x3f7ffffc;
    auVar93._16_4_ = 0x3f7ffffc;
    auVar93._20_4_ = 0x3f7ffffc;
    auVar93._24_4_ = 0x3f7ffffc;
    auVar93._28_4_ = 0x3f7ffffc;
    local_5e0 = vmulps_avx512vl(auVar89,auVar93);
    auVar89 = vmulps_avx512vl(auVar87,auVar87);
    auVar87 = vrsqrt14ps_avx512vl(auVar95);
    auVar94._8_4_ = 0xbf000000;
    auVar94._0_8_ = 0xbf000000bf000000;
    auVar94._12_4_ = 0xbf000000;
    auVar94._16_4_ = 0xbf000000;
    auVar94._20_4_ = 0xbf000000;
    auVar94._24_4_ = 0xbf000000;
    auVar94._28_4_ = 0xbf000000;
    auVar86 = vmulps_avx512vl(auVar95,auVar94);
    fVar145 = auVar87._0_4_;
    fVar160 = auVar87._4_4_;
    fVar161 = auVar87._8_4_;
    fVar162 = auVar87._12_4_;
    fVar164 = auVar87._16_4_;
    fVar163 = auVar87._20_4_;
    fVar165 = auVar87._24_4_;
    auVar106._4_4_ = fVar160 * fVar160 * fVar160 * auVar86._4_4_;
    auVar106._0_4_ = fVar145 * fVar145 * fVar145 * auVar86._0_4_;
    auVar106._8_4_ = fVar161 * fVar161 * fVar161 * auVar86._8_4_;
    auVar106._12_4_ = fVar162 * fVar162 * fVar162 * auVar86._12_4_;
    auVar106._16_4_ = fVar164 * fVar164 * fVar164 * auVar86._16_4_;
    auVar106._20_4_ = fVar163 * fVar163 * fVar163 * auVar86._20_4_;
    auVar106._24_4_ = fVar165 * fVar165 * fVar165 * auVar86._24_4_;
    auVar106._28_4_ = auVar104._28_4_;
    auVar95._8_4_ = 0x3fc00000;
    auVar95._0_8_ = 0x3fc000003fc00000;
    auVar95._12_4_ = 0x3fc00000;
    auVar95._16_4_ = 0x3fc00000;
    auVar95._20_4_ = 0x3fc00000;
    auVar95._24_4_ = 0x3fc00000;
    auVar95._28_4_ = 0x3fc00000;
    auVar87 = vfmadd231ps_avx512vl(auVar106,auVar87,auVar95);
    auVar86 = vmulps_avx512vl(auVar90,auVar87);
    auVar93 = vmulps_avx512vl(auVar91,auVar87);
    auVar94 = vmulps_avx512vl(auVar92,auVar87);
    auVar208 = ZEXT1632(auVar84);
    auVar95 = vsubps_avx512vl(auVar121,auVar208);
    auVar105 = vsubps_avx512vl(auVar121,auVar96);
    auVar106 = vsubps_avx512vl(auVar121,auVar97);
    auVar104 = vmulps_avx512vl(auVar250._0_32_,auVar106);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar248._0_32_,auVar105);
    local_700 = auVar251._0_32_;
    auVar104 = vfmadd231ps_avx512vl(auVar104,local_700,auVar95);
    auVar107 = vmulps_avx512vl(auVar106,auVar106);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,auVar105);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar95,auVar95);
    auVar108 = vmulps_avx512vl(auVar250._0_32_,auVar94);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar93,auVar248._0_32_);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar86,local_700);
    auVar94 = vmulps_avx512vl(auVar106,auVar94);
    auVar93 = vfmadd231ps_avx512vl(auVar94,auVar105,auVar93);
    auVar86 = vfmadd231ps_avx512vl(auVar93,auVar95,auVar86);
    auVar93 = vmulps_avx512vl(auVar108,auVar108);
    auVar94 = vsubps_avx512vl(local_1e0,auVar93);
    auVar109 = vmulps_avx512vl(auVar108,auVar86);
    auVar104 = vsubps_avx512vl(auVar104,auVar109);
    auVar109 = vaddps_avx512vl(auVar104,auVar104);
    auVar104 = vmulps_avx512vl(auVar86,auVar86);
    local_5a0 = vsubps_avx512vl(auVar107,auVar104);
    auVar89 = vsubps_avx512vl(local_5a0,auVar89);
    local_560 = vmulps_avx512vl(auVar109,auVar109);
    auVar104._8_4_ = 0x40800000;
    auVar104._0_8_ = 0x4080000040800000;
    auVar104._12_4_ = 0x40800000;
    auVar104._16_4_ = 0x40800000;
    auVar104._20_4_ = 0x40800000;
    auVar104._24_4_ = 0x40800000;
    auVar104._28_4_ = 0x40800000;
    _local_380 = vmulps_avx512vl(auVar94,auVar104);
    auVar104 = vmulps_avx512vl(_local_380,auVar89);
    auVar104 = vsubps_avx512vl(local_560,auVar104);
    uVar61 = vcmpps_avx512vl(auVar104,auVar121,5);
    bVar50 = (byte)uVar61;
    if (bVar50 == 0) {
LAB_0189234b:
      auVar248 = ZEXT3264(local_6e0);
      auVar250 = ZEXT3264(local_7a0);
      auVar232 = ZEXT3264(local_600);
      auVar236 = ZEXT3264(local_620);
      auVar229 = ZEXT3264(local_5c0);
      auVar239 = ZEXT3264(local_640);
      auVar209 = ZEXT3264(local_4e0);
      auVar223 = ZEXT3264(local_4c0);
      auVar253 = ZEXT3264(local_7c0);
      auVar241 = ZEXT3264(local_7e0);
      auVar89 = vmovdqa64_avx512vl(local_800);
      auVar242 = ZEXT3264(auVar89);
      auVar243 = ZEXT3264(local_820);
      auVar244 = ZEXT3264(local_840);
      auVar245 = ZEXT3264(local_860);
      auVar246 = ZEXT3264(local_880);
      auVar247 = ZEXT3264(local_8a0);
      auVar249 = ZEXT3264(local_8c0);
      auVar252 = ZEXT3264(local_720);
    }
    else {
      auVar121 = _local_380;
      auVar104 = vsqrtps_avx512vl(auVar104);
      auVar110 = vaddps_avx512vl(auVar94,auVar94);
      local_400 = vrcp14ps_avx512vl(auVar110);
      auVar88 = vfnmadd213ps_avx512vl(local_400,auVar110,auVar88);
      auVar107 = vfmadd132ps_avx512vl(auVar88,local_400,local_400);
      auVar88._8_4_ = 0x80000000;
      auVar88._0_8_ = 0x8000000080000000;
      auVar88._12_4_ = 0x80000000;
      auVar88._16_4_ = 0x80000000;
      auVar88._20_4_ = 0x80000000;
      auVar88._24_4_ = 0x80000000;
      auVar88._28_4_ = 0x80000000;
      local_4a0 = vxorps_avx512vl(auVar109,auVar88);
      auVar88 = vsubps_avx512vl(local_4a0,auVar104);
      local_580 = vmulps_avx512vl(auVar88,auVar107);
      auVar104 = vsubps_avx512vl(auVar104,auVar109);
      local_3a0 = vmulps_avx512vl(auVar104,auVar107);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar104 = vblendmps_avx512vl(auVar104,local_580);
      auVar111._0_4_ =
           (uint)(bVar50 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar107._0_4_;
      bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar58 * auVar104._4_4_ | (uint)!bVar58 * auVar107._4_4_;
      bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar58 * auVar104._8_4_ | (uint)!bVar58 * auVar107._8_4_;
      bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar58 * auVar104._12_4_ | (uint)!bVar58 * auVar107._12_4_;
      bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar111._16_4_ = (uint)bVar58 * auVar104._16_4_ | (uint)!bVar58 * auVar107._16_4_;
      bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar111._20_4_ = (uint)bVar58 * auVar104._20_4_ | (uint)!bVar58 * auVar107._20_4_;
      bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar111._24_4_ = (uint)bVar58 * auVar104._24_4_ | (uint)!bVar58 * auVar107._24_4_;
      bVar58 = SUB81(uVar61 >> 7,0);
      auVar111._28_4_ = (uint)bVar58 * auVar104._28_4_ | (uint)!bVar58 * auVar107._28_4_;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar88 = vblendmps_avx512vl(auVar104,local_3a0);
      auVar112._0_4_ =
           (uint)(bVar50 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar104._0_4_;
      bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar58 * auVar88._4_4_ | (uint)!bVar58 * auVar104._4_4_;
      bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar58 * auVar88._8_4_ | (uint)!bVar58 * auVar104._8_4_;
      bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar58 * auVar88._12_4_ | (uint)!bVar58 * auVar104._12_4_;
      bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar112._16_4_ = (uint)bVar58 * auVar88._16_4_ | (uint)!bVar58 * auVar104._16_4_;
      bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar112._20_4_ = (uint)bVar58 * auVar88._20_4_ | (uint)!bVar58 * auVar104._20_4_;
      bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar112._24_4_ = (uint)bVar58 * auVar88._24_4_ | (uint)!bVar58 * auVar104._24_4_;
      bVar58 = SUB81(uVar61 >> 7,0);
      auVar112._28_4_ = (uint)bVar58 * auVar88._28_4_ | (uint)!bVar58 * auVar104._28_4_;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar93,auVar104);
      local_3c0 = vmaxps_avx512vl(local_200,auVar104);
      auVar107._8_4_ = 0x36000000;
      auVar107._0_8_ = 0x3600000036000000;
      auVar107._12_4_ = 0x36000000;
      auVar107._16_4_ = 0x36000000;
      auVar107._20_4_ = 0x36000000;
      auVar107._24_4_ = 0x36000000;
      auVar107._28_4_ = 0x36000000;
      local_3e0 = vmulps_avx512vl(local_3c0,auVar107);
      vandps_avx512vl(auVar94,auVar104);
      uVar52 = vcmpps_avx512vl(local_3e0,local_3e0,1);
      uVar61 = uVar61 & uVar52;
      bVar55 = (byte)uVar61;
      if (bVar55 != 0) {
        uVar52 = vcmpps_avx512vl(auVar89,_DAT_01f7b000,2);
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar94 = vblendmps_avx512vl(auVar89,auVar93);
        bVar53 = (byte)uVar52;
        uVar62 = (uint)(bVar53 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar53 & 1) * local_3e0._0_4_;
        bVar58 = (bool)((byte)(uVar52 >> 1) & 1);
        uVar123 = (uint)bVar58 * auVar94._4_4_ | (uint)!bVar58 * local_3e0._4_4_;
        bVar58 = (bool)((byte)(uVar52 >> 2) & 1);
        uVar124 = (uint)bVar58 * auVar94._8_4_ | (uint)!bVar58 * local_3e0._8_4_;
        bVar58 = (bool)((byte)(uVar52 >> 3) & 1);
        uVar125 = (uint)bVar58 * auVar94._12_4_ | (uint)!bVar58 * local_3e0._12_4_;
        bVar58 = (bool)((byte)(uVar52 >> 4) & 1);
        uVar126 = (uint)bVar58 * auVar94._16_4_ | (uint)!bVar58 * local_3e0._16_4_;
        bVar58 = (bool)((byte)(uVar52 >> 5) & 1);
        uVar127 = (uint)bVar58 * auVar94._20_4_ | (uint)!bVar58 * local_3e0._20_4_;
        bVar58 = (bool)((byte)(uVar52 >> 6) & 1);
        uVar128 = (uint)bVar58 * auVar94._24_4_ | (uint)!bVar58 * local_3e0._24_4_;
        bVar58 = SUB81(uVar52 >> 7,0);
        uVar129 = (uint)bVar58 * auVar94._28_4_ | (uint)!bVar58 * local_3e0._28_4_;
        auVar111._0_4_ = (bVar55 & 1) * uVar62 | !(bool)(bVar55 & 1) * auVar111._0_4_;
        bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar111._4_4_ = bVar58 * uVar123 | !bVar58 * auVar111._4_4_;
        bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar111._8_4_ = bVar58 * uVar124 | !bVar58 * auVar111._8_4_;
        bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar111._12_4_ = bVar58 * uVar125 | !bVar58 * auVar111._12_4_;
        bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar111._16_4_ = bVar58 * uVar126 | !bVar58 * auVar111._16_4_;
        bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar111._20_4_ = bVar58 * uVar127 | !bVar58 * auVar111._20_4_;
        bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar111._24_4_ = bVar58 * uVar128 | !bVar58 * auVar111._24_4_;
        bVar58 = SUB81(uVar61 >> 7,0);
        auVar111._28_4_ = bVar58 * uVar129 | !bVar58 * auVar111._28_4_;
        auVar89 = vblendmps_avx512vl(auVar93,auVar89);
        bVar58 = (bool)((byte)(uVar52 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar52 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar52 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar52 >> 4) & 1);
        bVar17 = (bool)((byte)(uVar52 >> 5) & 1);
        bVar18 = (bool)((byte)(uVar52 >> 6) & 1);
        bVar19 = SUB81(uVar52 >> 7,0);
        auVar112._0_4_ =
             (uint)(bVar55 & 1) *
             ((uint)(bVar53 & 1) * auVar89._0_4_ | !(bool)(bVar53 & 1) * uVar62) |
             !(bool)(bVar55 & 1) * auVar112._0_4_;
        bVar13 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar112._4_4_ =
             (uint)bVar13 * ((uint)bVar58 * auVar89._4_4_ | !bVar58 * uVar123) |
             !bVar13 * auVar112._4_4_;
        bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar112._8_4_ =
             (uint)bVar58 * ((uint)bVar14 * auVar89._8_4_ | !bVar14 * uVar124) |
             !bVar58 * auVar112._8_4_;
        bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar112._12_4_ =
             (uint)bVar58 * ((uint)bVar15 * auVar89._12_4_ | !bVar15 * uVar125) |
             !bVar58 * auVar112._12_4_;
        bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar112._16_4_ =
             (uint)bVar58 * ((uint)bVar16 * auVar89._16_4_ | !bVar16 * uVar126) |
             !bVar58 * auVar112._16_4_;
        bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar112._20_4_ =
             (uint)bVar58 * ((uint)bVar17 * auVar89._20_4_ | !bVar17 * uVar127) |
             !bVar58 * auVar112._20_4_;
        bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar112._24_4_ =
             (uint)bVar58 * ((uint)bVar18 * auVar89._24_4_ | !bVar18 * uVar128) |
             !bVar58 * auVar112._24_4_;
        bVar58 = SUB81(uVar61 >> 7,0);
        auVar112._28_4_ =
             (uint)bVar58 * ((uint)bVar19 * auVar89._28_4_ | !bVar19 * uVar129) |
             !bVar58 * auVar112._28_4_;
        bVar50 = (~bVar55 | bVar53) & bVar50;
      }
      if ((bVar50 & 0x7f) == 0) goto LAB_0189234b;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar88 = vxorps_avx512vl(auVar103,auVar104);
      auVar101 = vxorps_avx512vl(auVar101,auVar104);
      auVar103 = vxorps_avx512vl(auVar102,auVar104);
      auVar77 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_540);
      auVar89 = vbroadcastss_avx512vl(auVar77);
      auVar89 = vmaxps_avx512vl(auVar89,auVar111);
      auVar77 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_540);
      auVar93 = vbroadcastss_avx512vl(auVar77);
      auVar93 = vminps_avx512vl(auVar93,auVar112);
      auVar94 = vmulps_avx512vl(auVar106,auVar115);
      auVar94 = vfmadd213ps_avx512vl(auVar105,auVar114,auVar94);
      auVar77 = vfmadd213ps_fma(auVar95,auVar113,auVar94);
      auVar94 = vmulps_avx512vl(local_7a0,auVar115);
      auVar94 = vfmadd231ps_avx512vl(auVar94,local_6e0,auVar114);
      auVar94 = vfmadd231ps_avx512vl(auVar94,local_700,auVar113);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar94,auVar95);
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar22 = vcmpps_avx512vl(auVar95,auVar105,1);
      auVar106 = vxorps_avx512vl(ZEXT1632(auVar77),auVar104);
      auVar107 = vrcp14ps_avx512vl(auVar94);
      auVar113 = vxorps_avx512vl(auVar94,auVar104);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar102 = vfnmadd213ps_avx512vl(auVar107,auVar94,auVar114);
      auVar77 = vfmadd132ps_fma(auVar102,auVar107,auVar107);
      fVar145 = auVar77._0_4_ * auVar106._0_4_;
      fVar160 = auVar77._4_4_ * auVar106._4_4_;
      auVar102._4_4_ = fVar160;
      auVar102._0_4_ = fVar145;
      fVar161 = auVar77._8_4_ * auVar106._8_4_;
      auVar102._8_4_ = fVar161;
      fVar162 = auVar77._12_4_ * auVar106._12_4_;
      auVar102._12_4_ = fVar162;
      fVar164 = auVar106._16_4_ * 0.0;
      auVar102._16_4_ = fVar164;
      fVar163 = auVar106._20_4_ * 0.0;
      auVar102._20_4_ = fVar163;
      fVar165 = auVar106._24_4_ * 0.0;
      auVar102._24_4_ = fVar165;
      auVar102._28_4_ = auVar106._28_4_;
      uVar24 = vcmpps_avx512vl(auVar94,auVar113,1);
      bVar55 = (byte)uVar22 | (byte)uVar24;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar102 = vblendmps_avx512vl(auVar102,auVar115);
      auVar116._0_4_ =
           (uint)(bVar55 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar107._0_4_;
      bVar58 = (bool)(bVar55 >> 1 & 1);
      auVar116._4_4_ = (uint)bVar58 * auVar102._4_4_ | (uint)!bVar58 * auVar107._4_4_;
      bVar58 = (bool)(bVar55 >> 2 & 1);
      auVar116._8_4_ = (uint)bVar58 * auVar102._8_4_ | (uint)!bVar58 * auVar107._8_4_;
      bVar58 = (bool)(bVar55 >> 3 & 1);
      auVar116._12_4_ = (uint)bVar58 * auVar102._12_4_ | (uint)!bVar58 * auVar107._12_4_;
      bVar58 = (bool)(bVar55 >> 4 & 1);
      auVar116._16_4_ = (uint)bVar58 * auVar102._16_4_ | (uint)!bVar58 * auVar107._16_4_;
      bVar58 = (bool)(bVar55 >> 5 & 1);
      auVar116._20_4_ = (uint)bVar58 * auVar102._20_4_ | (uint)!bVar58 * auVar107._20_4_;
      bVar58 = (bool)(bVar55 >> 6 & 1);
      auVar116._24_4_ = (uint)bVar58 * auVar102._24_4_ | (uint)!bVar58 * auVar107._24_4_;
      auVar116._28_4_ =
           (uint)(bVar55 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar107._28_4_;
      auVar102 = vmaxps_avx512vl(auVar89,auVar116);
      uVar24 = vcmpps_avx512vl(auVar94,auVar113,6);
      bVar55 = (byte)uVar22 | (byte)uVar24;
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar117._0_4_ =
           (uint)(bVar55 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)fVar145;
      bVar58 = (bool)(bVar55 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar58 * auVar107._4_4_ | (uint)!bVar58 * (int)fVar160;
      bVar58 = (bool)(bVar55 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar58 * auVar107._8_4_ | (uint)!bVar58 * (int)fVar161;
      bVar58 = (bool)(bVar55 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar58 * auVar107._12_4_ | (uint)!bVar58 * (int)fVar162;
      bVar58 = (bool)(bVar55 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar58 * auVar107._16_4_ | (uint)!bVar58 * (int)fVar164;
      bVar58 = (bool)(bVar55 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar58 * auVar107._20_4_ | (uint)!bVar58 * (int)fVar163;
      bVar58 = (bool)(bVar55 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar58 * auVar107._24_4_ | (uint)!bVar58 * (int)fVar165;
      auVar117._28_4_ =
           (uint)(bVar55 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar106._28_4_;
      auVar106 = vminps_avx512vl(auVar93,auVar117);
      auVar89 = vsubps_avx(ZEXT832(0) << 0x20,auVar98);
      auVar93 = vsubps_avx(ZEXT832(0) << 0x20,auVar99);
      auVar98 = ZEXT832(0) << 0x20;
      auVar94 = vsubps_avx(auVar98,auVar100);
      auVar94 = vmulps_avx512vl(auVar94,auVar88);
      auVar93 = vfmadd231ps_avx512vl(auVar94,auVar103,auVar93);
      auVar89 = vfmadd231ps_avx512vl(auVar93,auVar101,auVar89);
      auVar93 = vmulps_avx512vl(local_7a0,auVar88);
      auVar248 = ZEXT3264(local_6e0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,local_6e0,auVar103);
      auVar93 = vfmadd231ps_avx512vl(auVar93,local_700,auVar101);
      vandps_avx512vl(auVar93,auVar95);
      uVar22 = vcmpps_avx512vl(auVar93,auVar105,1);
      auVar89 = vxorps_avx512vl(auVar89,auVar104);
      auVar94 = vrcp14ps_avx512vl(auVar93);
      auVar95 = vxorps_avx512vl(auVar93,auVar104);
      auVar104 = vfnmadd213ps_avx512vl(auVar94,auVar93,auVar114);
      auVar77 = vfmadd132ps_fma(auVar104,auVar94,auVar94);
      fVar145 = auVar77._0_4_ * auVar89._0_4_;
      fVar160 = auVar77._4_4_ * auVar89._4_4_;
      auVar103._4_4_ = fVar160;
      auVar103._0_4_ = fVar145;
      fVar161 = auVar77._8_4_ * auVar89._8_4_;
      auVar103._8_4_ = fVar161;
      fVar162 = auVar77._12_4_ * auVar89._12_4_;
      auVar103._12_4_ = fVar162;
      fVar164 = auVar89._16_4_ * 0.0;
      auVar103._16_4_ = fVar164;
      fVar163 = auVar89._20_4_ * 0.0;
      auVar103._20_4_ = fVar163;
      fVar165 = auVar89._24_4_ * 0.0;
      auVar103._24_4_ = fVar165;
      auVar103._28_4_ = auVar89._28_4_;
      uVar24 = vcmpps_avx512vl(auVar93,auVar95,1);
      bVar55 = (byte)uVar22 | (byte)uVar24;
      auVar104 = vblendmps_avx512vl(auVar103,auVar115);
      auVar118._0_4_ =
           (uint)(bVar55 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar94._0_4_;
      bVar58 = (bool)(bVar55 >> 1 & 1);
      auVar118._4_4_ = (uint)bVar58 * auVar104._4_4_ | (uint)!bVar58 * auVar94._4_4_;
      bVar58 = (bool)(bVar55 >> 2 & 1);
      auVar118._8_4_ = (uint)bVar58 * auVar104._8_4_ | (uint)!bVar58 * auVar94._8_4_;
      bVar58 = (bool)(bVar55 >> 3 & 1);
      auVar118._12_4_ = (uint)bVar58 * auVar104._12_4_ | (uint)!bVar58 * auVar94._12_4_;
      bVar58 = (bool)(bVar55 >> 4 & 1);
      auVar118._16_4_ = (uint)bVar58 * auVar104._16_4_ | (uint)!bVar58 * auVar94._16_4_;
      bVar58 = (bool)(bVar55 >> 5 & 1);
      auVar118._20_4_ = (uint)bVar58 * auVar104._20_4_ | (uint)!bVar58 * auVar94._20_4_;
      bVar58 = (bool)(bVar55 >> 6 & 1);
      auVar118._24_4_ = (uint)bVar58 * auVar104._24_4_ | (uint)!bVar58 * auVar94._24_4_;
      auVar118._28_4_ =
           (uint)(bVar55 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar94._28_4_;
      local_360 = vmaxps_avx(auVar102,auVar118);
      uVar24 = vcmpps_avx512vl(auVar93,auVar95,6);
      bVar55 = (byte)uVar22 | (byte)uVar24;
      auVar119._0_4_ =
           (uint)(bVar55 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)fVar145;
      bVar58 = (bool)(bVar55 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar58 * auVar107._4_4_ | (uint)!bVar58 * (int)fVar160;
      bVar58 = (bool)(bVar55 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar58 * auVar107._8_4_ | (uint)!bVar58 * (int)fVar161;
      bVar58 = (bool)(bVar55 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar58 * auVar107._12_4_ | (uint)!bVar58 * (int)fVar162;
      bVar58 = (bool)(bVar55 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar58 * auVar107._16_4_ | (uint)!bVar58 * (int)fVar164;
      bVar58 = (bool)(bVar55 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar58 * auVar107._20_4_ | (uint)!bVar58 * (int)fVar163;
      bVar58 = (bool)(bVar55 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar58 * auVar107._24_4_ | (uint)!bVar58 * (int)fVar165;
      auVar119._28_4_ =
           (uint)(bVar55 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar89._28_4_;
      local_240 = vminps_avx(auVar106,auVar119);
      uVar22 = vcmpps_avx512vl(local_360,local_240,2);
      bVar50 = bVar50 & 0x7f & (byte)uVar22;
      if (bVar50 == 0) {
        auVar251 = ZEXT3264(local_700);
        goto LAB_0189234b;
      }
      auVar89 = vmaxps_avx(auVar98,local_5e0);
      auVar93 = vfmadd213ps_avx512vl(local_580,auVar108,auVar86);
      fVar145 = auVar87._0_4_;
      fVar160 = auVar87._4_4_;
      auVar40._4_4_ = fVar160 * auVar93._4_4_;
      auVar40._0_4_ = fVar145 * auVar93._0_4_;
      fVar161 = auVar87._8_4_;
      auVar40._8_4_ = fVar161 * auVar93._8_4_;
      fVar162 = auVar87._12_4_;
      auVar40._12_4_ = fVar162 * auVar93._12_4_;
      fVar164 = auVar87._16_4_;
      auVar40._16_4_ = fVar164 * auVar93._16_4_;
      fVar163 = auVar87._20_4_;
      auVar40._20_4_ = fVar163 * auVar93._20_4_;
      fVar165 = auVar87._24_4_;
      auVar40._24_4_ = fVar165 * auVar93._24_4_;
      auVar40._28_4_ = auVar93._28_4_;
      auVar93 = vfmadd213ps_avx512vl(local_3a0,auVar108,auVar86);
      auVar41._4_4_ = fVar160 * auVar93._4_4_;
      auVar41._0_4_ = fVar145 * auVar93._0_4_;
      auVar41._8_4_ = fVar161 * auVar93._8_4_;
      auVar41._12_4_ = fVar162 * auVar93._12_4_;
      auVar41._16_4_ = fVar164 * auVar93._16_4_;
      auVar41._20_4_ = fVar163 * auVar93._20_4_;
      auVar41._24_4_ = fVar165 * auVar93._24_4_;
      auVar41._28_4_ = auVar93._28_4_;
      auVar93 = vminps_avx512vl(auVar40,auVar114);
      auVar94 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar93 = vmaxps_avx(auVar93,ZEXT832(0) << 0x20);
      auVar95 = vminps_avx512vl(auVar41,auVar114);
      auVar42._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
      auVar42._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
      auVar42._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
      auVar42._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
      auVar42._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
      auVar42._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
      auVar42._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
      auVar42._28_4_ = auVar93._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar42,local_6c0,_local_8e0);
      auVar93 = vmaxps_avx(auVar95,ZEXT832(0) << 0x20);
      auVar43._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
      auVar43._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
      auVar43._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
      auVar43._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
      auVar43._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
      auVar43._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
      auVar43._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
      auVar43._28_4_ = auVar93._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar43,local_6c0,_local_8e0);
      auVar44._4_4_ = auVar89._4_4_ * auVar89._4_4_;
      auVar44._0_4_ = auVar89._0_4_ * auVar89._0_4_;
      auVar44._8_4_ = auVar89._8_4_ * auVar89._8_4_;
      auVar44._12_4_ = auVar89._12_4_ * auVar89._12_4_;
      auVar44._16_4_ = auVar89._16_4_ * auVar89._16_4_;
      auVar44._20_4_ = auVar89._20_4_ * auVar89._20_4_;
      auVar44._24_4_ = auVar89._24_4_ * auVar89._24_4_;
      auVar44._28_4_ = auVar89._28_4_;
      auVar93 = vsubps_avx(local_5a0,auVar44);
      auVar45._4_4_ = auVar93._4_4_ * (float)local_380._4_4_;
      auVar45._0_4_ = auVar93._0_4_ * (float)local_380._0_4_;
      auVar45._8_4_ = auVar93._8_4_ * fStack_378;
      auVar45._12_4_ = auVar93._12_4_ * fStack_374;
      auVar45._16_4_ = auVar93._16_4_ * fStack_370;
      auVar45._20_4_ = auVar93._20_4_ * fStack_36c;
      auVar45._24_4_ = auVar93._24_4_ * fStack_368;
      auVar45._28_4_ = auVar89._28_4_;
      auVar89 = vsubps_avx(local_560,auVar45);
      uVar22 = vcmpps_avx512vl(auVar89,ZEXT832(0) << 0x20,5);
      bVar55 = (byte)uVar22;
      auVar252 = ZEXT3264(local_720);
      if (bVar55 == 0) {
        bVar55 = 0;
        auVar89 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar209 = ZEXT864(0) << 0x20;
        auVar95 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar104 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar231 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar108._8_4_ = 0x7f800000;
        auVar108._0_8_ = 0x7f8000007f800000;
        auVar108._12_4_ = 0x7f800000;
        auVar108._16_4_ = 0x7f800000;
        auVar108._20_4_ = 0x7f800000;
        auVar108._24_4_ = 0x7f800000;
        auVar108._28_4_ = 0x7f800000;
        auVar109._8_4_ = 0xff800000;
        auVar109._0_8_ = 0xff800000ff800000;
        auVar109._12_4_ = 0xff800000;
        auVar109._16_4_ = 0xff800000;
        auVar109._20_4_ = 0xff800000;
        auVar109._24_4_ = 0xff800000;
        auVar109._28_4_ = 0xff800000;
      }
      else {
        auVar83 = vxorps_avx512vl(auVar213,auVar213);
        uVar61 = vcmpps_avx512vl(auVar89,auVar98,5);
        auVar89 = vsqrtps_avx(auVar89);
        auVar94 = vfnmadd213ps_avx512vl(auVar110,local_400,auVar114);
        auVar104 = vfmadd132ps_avx512vl(auVar94,local_400,local_400);
        auVar94 = vsubps_avx(local_4a0,auVar89);
        auVar98 = vmulps_avx512vl(auVar94,auVar104);
        auVar89 = vsubps_avx512vl(auVar89,auVar109);
        auVar105 = vmulps_avx512vl(auVar89,auVar104);
        auVar89 = vfmadd213ps_avx512vl(auVar108,auVar98,auVar86);
        auVar110._4_4_ = fVar160 * auVar89._4_4_;
        auVar110._0_4_ = fVar145 * auVar89._0_4_;
        auVar110._8_4_ = fVar161 * auVar89._8_4_;
        auVar110._12_4_ = fVar162 * auVar89._12_4_;
        auVar110._16_4_ = fVar164 * auVar89._16_4_;
        auVar110._20_4_ = fVar163 * auVar89._20_4_;
        auVar110._24_4_ = fVar165 * auVar89._24_4_;
        auVar110._28_4_ = auVar95._28_4_;
        auVar89 = vmulps_avx512vl(local_700,auVar98);
        auVar94 = vmulps_avx512vl(local_6e0,auVar98);
        auVar106 = vmulps_avx512vl(local_7a0,auVar98);
        auVar95 = vfmadd213ps_avx512vl(auVar90,auVar110,auVar208);
        auVar95 = vsubps_avx512vl(auVar89,auVar95);
        auVar89 = vfmadd213ps_avx512vl(auVar91,auVar110,auVar96);
        auVar104 = vsubps_avx512vl(auVar94,auVar89);
        auVar77 = vfmadd213ps_fma(auVar110,auVar92,auVar97);
        auVar89 = vsubps_avx(auVar106,ZEXT1632(auVar77));
        auVar231 = auVar89._0_28_;
        auVar89 = vfmadd213ps_avx512vl(auVar108,auVar105,auVar86);
        auVar46._4_4_ = fVar160 * auVar89._4_4_;
        auVar46._0_4_ = fVar145 * auVar89._0_4_;
        auVar46._8_4_ = fVar161 * auVar89._8_4_;
        auVar46._12_4_ = fVar162 * auVar89._12_4_;
        auVar46._16_4_ = fVar164 * auVar89._16_4_;
        auVar46._20_4_ = fVar163 * auVar89._20_4_;
        auVar46._24_4_ = fVar165 * auVar89._24_4_;
        auVar46._28_4_ = auVar87._28_4_;
        auVar89 = vmulps_avx512vl(local_700,auVar105);
        auVar87 = vmulps_avx512vl(local_6e0,auVar105);
        auVar86 = vmulps_avx512vl(local_7a0,auVar105);
        auVar77 = vfmadd213ps_fma(auVar90,auVar46,auVar208);
        auVar94 = vsubps_avx(auVar89,ZEXT1632(auVar77));
        auVar77 = vfmadd213ps_fma(auVar91,auVar46,auVar96);
        auVar89 = vsubps_avx(auVar87,ZEXT1632(auVar77));
        auVar77 = vfmadd213ps_fma(auVar92,auVar46,auVar97);
        auVar87 = vsubps_avx512vl(auVar86,ZEXT1632(auVar77));
        auVar209 = ZEXT3264(auVar87);
        auVar182._8_4_ = 0x7f800000;
        auVar182._0_8_ = 0x7f8000007f800000;
        auVar182._12_4_ = 0x7f800000;
        auVar182._16_4_ = 0x7f800000;
        auVar182._20_4_ = 0x7f800000;
        auVar182._24_4_ = 0x7f800000;
        auVar182._28_4_ = 0x7f800000;
        auVar87 = vblendmps_avx512vl(auVar182,auVar98);
        bVar58 = (bool)((byte)uVar61 & 1);
        auVar108._0_4_ = (uint)bVar58 * auVar87._0_4_ | (uint)!bVar58 * auVar84._0_4_;
        bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar58 * auVar87._4_4_ | (uint)!bVar58 * auVar84._4_4_;
        bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar58 * auVar87._8_4_ | (uint)!bVar58 * auVar84._8_4_;
        bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar58 * auVar87._12_4_ | (uint)!bVar58 * auVar84._12_4_;
        iVar1 = (uint)((byte)(uVar61 >> 4) & 1) * auVar87._16_4_;
        auVar108._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar61 >> 5) & 1) * auVar87._20_4_;
        auVar108._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar61 >> 6) & 1) * auVar87._24_4_;
        auVar108._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar61 >> 7) * auVar87._28_4_;
        auVar108._28_4_ = iVar4;
        auVar183._8_4_ = 0xff800000;
        auVar183._0_8_ = 0xff800000ff800000;
        auVar183._12_4_ = 0xff800000;
        auVar183._16_4_ = 0xff800000;
        auVar183._20_4_ = 0xff800000;
        auVar183._24_4_ = 0xff800000;
        auVar183._28_4_ = 0xff800000;
        auVar87 = vblendmps_avx512vl(auVar183,auVar105);
        bVar58 = (bool)((byte)uVar61 & 1);
        auVar109._0_4_ = (uint)bVar58 * auVar87._0_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar58 * auVar87._4_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar58 * auVar87._8_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar58 * auVar87._12_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar109._16_4_ = (uint)bVar58 * auVar87._16_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar109._20_4_ = (uint)bVar58 * auVar87._20_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar109._24_4_ = (uint)bVar58 * auVar87._24_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = SUB81(uVar61 >> 7,0);
        auVar109._28_4_ = (uint)bVar58 * auVar87._28_4_ | (uint)!bVar58 * -0x800000;
        auVar208._8_4_ = 0x36000000;
        auVar208._0_8_ = 0x3600000036000000;
        auVar208._12_4_ = 0x36000000;
        auVar208._16_4_ = 0x36000000;
        auVar208._20_4_ = 0x36000000;
        auVar208._24_4_ = 0x36000000;
        auVar208._28_4_ = 0x36000000;
        auVar87 = vmulps_avx512vl(local_3c0,auVar208);
        uVar52 = vcmpps_avx512vl(auVar87,local_3e0,0xe);
        uVar61 = uVar61 & uVar52;
        bVar53 = (byte)uVar61;
        if (bVar53 != 0) {
          uVar52 = vcmpps_avx512vl(auVar93,ZEXT1632(auVar83),2);
          auVar227._8_4_ = 0x7f800000;
          auVar227._0_8_ = 0x7f8000007f800000;
          auVar227._12_4_ = 0x7f800000;
          auVar227._16_4_ = 0x7f800000;
          auVar227._20_4_ = 0x7f800000;
          auVar227._24_4_ = 0x7f800000;
          auVar227._28_4_ = 0x7f800000;
          auVar238._8_4_ = 0xff800000;
          auVar238._0_8_ = 0xff800000ff800000;
          auVar238._12_4_ = 0xff800000;
          auVar238._16_4_ = 0xff800000;
          auVar238._20_4_ = 0xff800000;
          auVar238._24_4_ = 0xff800000;
          auVar238._28_4_ = 0xff800000;
          auVar86 = vblendmps_avx512vl(auVar227,auVar238);
          bVar51 = (byte)uVar52;
          uVar62 = (uint)(bVar51 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar87._0_4_;
          bVar58 = (bool)((byte)(uVar52 >> 1) & 1);
          uVar123 = (uint)bVar58 * auVar86._4_4_ | (uint)!bVar58 * auVar87._4_4_;
          bVar58 = (bool)((byte)(uVar52 >> 2) & 1);
          uVar124 = (uint)bVar58 * auVar86._8_4_ | (uint)!bVar58 * auVar87._8_4_;
          bVar58 = (bool)((byte)(uVar52 >> 3) & 1);
          uVar125 = (uint)bVar58 * auVar86._12_4_ | (uint)!bVar58 * auVar87._12_4_;
          bVar58 = (bool)((byte)(uVar52 >> 4) & 1);
          uVar126 = (uint)bVar58 * auVar86._16_4_ | (uint)!bVar58 * auVar87._16_4_;
          bVar58 = (bool)((byte)(uVar52 >> 5) & 1);
          uVar127 = (uint)bVar58 * auVar86._20_4_ | (uint)!bVar58 * auVar87._20_4_;
          bVar58 = (bool)((byte)(uVar52 >> 6) & 1);
          uVar128 = (uint)bVar58 * auVar86._24_4_ | (uint)!bVar58 * auVar87._24_4_;
          bVar58 = SUB81(uVar52 >> 7,0);
          uVar129 = (uint)bVar58 * auVar86._28_4_ | (uint)!bVar58 * auVar87._28_4_;
          auVar108._0_4_ = (bVar53 & 1) * uVar62 | !(bool)(bVar53 & 1) * auVar108._0_4_;
          bVar58 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar108._4_4_ = bVar58 * uVar123 | !bVar58 * auVar108._4_4_;
          bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar108._8_4_ = bVar58 * uVar124 | !bVar58 * auVar108._8_4_;
          bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar108._12_4_ = bVar58 * uVar125 | !bVar58 * auVar108._12_4_;
          bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar108._16_4_ = bVar58 * uVar126 | (uint)!bVar58 * iVar1;
          bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar108._20_4_ = bVar58 * uVar127 | (uint)!bVar58 * iVar2;
          bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar108._24_4_ = bVar58 * uVar128 | (uint)!bVar58 * iVar3;
          bVar58 = SUB81(uVar61 >> 7,0);
          auVar108._28_4_ = bVar58 * uVar129 | (uint)!bVar58 * iVar4;
          auVar87 = vblendmps_avx512vl(auVar238,auVar227);
          bVar58 = (bool)((byte)(uVar52 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar52 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar52 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar52 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar52 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar52 >> 6) & 1);
          bVar19 = SUB81(uVar52 >> 7,0);
          auVar109._0_4_ =
               (uint)(bVar53 & 1) *
               ((uint)(bVar51 & 1) * auVar87._0_4_ | !(bool)(bVar51 & 1) * uVar62) |
               !(bool)(bVar53 & 1) * auVar109._0_4_;
          bVar13 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar109._4_4_ =
               (uint)bVar13 * ((uint)bVar58 * auVar87._4_4_ | !bVar58 * uVar123) |
               !bVar13 * auVar109._4_4_;
          bVar58 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar109._8_4_ =
               (uint)bVar58 * ((uint)bVar14 * auVar87._8_4_ | !bVar14 * uVar124) |
               !bVar58 * auVar109._8_4_;
          bVar58 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar109._12_4_ =
               (uint)bVar58 * ((uint)bVar15 * auVar87._12_4_ | !bVar15 * uVar125) |
               !bVar58 * auVar109._12_4_;
          bVar58 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar109._16_4_ =
               (uint)bVar58 * ((uint)bVar16 * auVar87._16_4_ | !bVar16 * uVar126) |
               !bVar58 * auVar109._16_4_;
          bVar58 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar109._20_4_ =
               (uint)bVar58 * ((uint)bVar17 * auVar87._20_4_ | !bVar17 * uVar127) |
               !bVar58 * auVar109._20_4_;
          bVar58 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar109._24_4_ =
               (uint)bVar58 * ((uint)bVar18 * auVar87._24_4_ | !bVar18 * uVar128) |
               !bVar58 * auVar109._24_4_;
          bVar58 = SUB81(uVar61 >> 7,0);
          auVar109._28_4_ =
               (uint)bVar58 * ((uint)bVar19 * auVar87._28_4_ | !bVar19 * uVar129) |
               !bVar58 * auVar109._28_4_;
          bVar55 = (~bVar53 | bVar51) & bVar55;
        }
      }
      auVar251 = ZEXT3264(local_700);
      auVar250 = ZEXT3264(local_7a0);
      auVar253 = ZEXT3264(local_7c0);
      auVar241 = ZEXT3264(local_7e0);
      auVar87 = vmovdqa64_avx512vl(local_800);
      auVar242 = ZEXT3264(auVar87);
      auVar243 = ZEXT3264(local_820);
      auVar244 = ZEXT3264(local_840);
      auVar245 = ZEXT3264(local_860);
      auVar246 = ZEXT3264(local_880);
      auVar247 = ZEXT3264(local_8a0);
      auVar249 = ZEXT3264(local_8c0);
      uVar130 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar222._4_4_ = uVar130;
      auVar222._0_4_ = uVar130;
      auVar222._8_4_ = uVar130;
      auVar222._12_4_ = uVar130;
      auVar222._16_4_ = uVar130;
      auVar222._20_4_ = uVar130;
      auVar222._24_4_ = uVar130;
      auVar222._28_4_ = uVar130;
      uVar130 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar228._4_4_ = uVar130;
      auVar228._0_4_ = uVar130;
      auVar228._8_4_ = uVar130;
      auVar228._12_4_ = uVar130;
      auVar228._16_4_ = uVar130;
      auVar228._20_4_ = uVar130;
      auVar228._24_4_ = uVar130;
      auVar228._28_4_ = uVar130;
      fVar145 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar223._0_4_ = fVar145 * auVar209._0_4_;
      auVar223._4_4_ = fVar145 * auVar209._4_4_;
      auVar223._8_4_ = fVar145 * auVar209._8_4_;
      auVar223._12_4_ = fVar145 * auVar209._12_4_;
      auVar223._16_4_ = fVar145 * auVar209._16_4_;
      auVar223._20_4_ = fVar145 * auVar209._20_4_;
      auVar223._28_36_ = auVar209._28_36_;
      auVar223._24_4_ = fVar145 * auVar209._24_4_;
      auVar77 = vfmadd231ps_fma(auVar223._0_32_,auVar228,auVar89);
      auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar222,auVar94);
      _local_2a0 = local_360;
      local_280 = vminps_avx(local_240,auVar108);
      auVar235._8_4_ = 0x7fffffff;
      auVar235._0_8_ = 0x7fffffff7fffffff;
      auVar235._12_4_ = 0x7fffffff;
      auVar235._16_4_ = 0x7fffffff;
      auVar235._20_4_ = 0x7fffffff;
      auVar235._24_4_ = 0x7fffffff;
      auVar235._28_4_ = 0x7fffffff;
      auVar89 = vandps_avx(auVar235,ZEXT1632(auVar77));
      _local_260 = vmaxps_avx(local_360,auVar109);
      auVar218._8_4_ = 0x3e99999a;
      auVar218._0_8_ = 0x3e99999a3e99999a;
      auVar218._12_4_ = 0x3e99999a;
      auVar218._16_4_ = 0x3e99999a;
      auVar218._20_4_ = 0x3e99999a;
      auVar218._24_4_ = 0x3e99999a;
      auVar218._28_4_ = 0x3e99999a;
      uVar22 = vcmpps_avx512vl(auVar89,auVar218,1);
      uVar24 = vcmpps_avx512vl(local_360,local_280,2);
      bVar53 = (byte)uVar24 & bVar50;
      uVar23 = vcmpps_avx512vl(_local_260,local_240,2);
      if ((bVar50 & ((byte)uVar23 | (byte)uVar24)) == 0) {
        auVar232 = ZEXT3264(local_600);
        auVar236 = ZEXT3264(local_620);
        auVar229 = ZEXT3264(local_5c0);
        auVar239 = ZEXT3264(local_640);
        auVar209 = ZEXT3264(local_4e0);
        auVar223 = ZEXT3264(local_4c0);
      }
      else {
        _local_320 = _local_260;
        local_728 = (uint)(byte)((byte)uVar22 | ~bVar55);
        auVar47._4_4_ = auVar231._4_4_ * fVar145;
        auVar47._0_4_ = auVar231._0_4_ * fVar145;
        auVar47._8_4_ = auVar231._8_4_ * fVar145;
        auVar47._12_4_ = auVar231._12_4_ * fVar145;
        auVar47._16_4_ = auVar231._16_4_ * fVar145;
        auVar47._20_4_ = auVar231._20_4_ * fVar145;
        auVar47._24_4_ = auVar231._24_4_ * fVar145;
        auVar47._28_4_ = local_260._28_4_;
        auVar77 = vfmadd213ps_fma(auVar104,auVar228,auVar47);
        auVar77 = vfmadd213ps_fma(auVar95,auVar222,ZEXT1632(auVar77));
        auVar89 = vandps_avx(auVar235,ZEXT1632(auVar77));
        uVar22 = vcmpps_avx512vl(auVar89,auVar218,1);
        bVar55 = (byte)uVar22 | ~bVar55;
        auVar142._8_4_ = 2;
        auVar142._0_8_ = 0x200000002;
        auVar142._12_4_ = 2;
        auVar142._16_4_ = 2;
        auVar142._20_4_ = 2;
        auVar142._24_4_ = 2;
        auVar142._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar89 = vpblendmd_avx512vl(auVar142,auVar35);
        local_220._0_4_ = (uint)(bVar55 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar55 & 1) * 2;
        bVar58 = (bool)(bVar55 >> 1 & 1);
        local_220._4_4_ = (uint)bVar58 * auVar89._4_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar55 >> 2 & 1);
        local_220._8_4_ = (uint)bVar58 * auVar89._8_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar55 >> 3 & 1);
        local_220._12_4_ = (uint)bVar58 * auVar89._12_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar55 >> 4 & 1);
        local_220._16_4_ = (uint)bVar58 * auVar89._16_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar55 >> 5 & 1);
        local_220._20_4_ = (uint)bVar58 * auVar89._20_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar55 >> 6 & 1);
        local_220._24_4_ = (uint)bVar58 * auVar89._24_4_ | (uint)!bVar58 * 2;
        local_220._28_4_ = (uint)(bVar55 >> 7) * auVar89._28_4_ | (uint)!(bool)(bVar55 >> 7) * 2;
        local_2c0 = vpbroadcastd_avx512vl();
        uVar22 = vpcmpd_avx512vl(local_2c0,local_220,5);
        local_724 = (uint)bVar53;
        local_300 = local_360._0_4_ + (float)local_340._0_4_;
        fStack_2fc = local_360._4_4_ + (float)local_340._4_4_;
        fStack_2f8 = local_360._8_4_ + fStack_338;
        fStack_2f4 = local_360._12_4_ + fStack_334;
        fStack_2f0 = local_360._16_4_ + fStack_330;
        fStack_2ec = local_360._20_4_ + fStack_32c;
        fStack_2e8 = local_360._24_4_ + fStack_328;
        fStack_2e4 = local_360._28_4_ + fStack_324;
        _local_380 = auVar121;
        for (bVar53 = (byte)uVar22 & bVar53; auVar89 = _local_8e0, bVar53 != 0;
            bVar53 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar53 & (byte)uVar22) {
          auVar143._8_4_ = 0x7f800000;
          auVar143._0_8_ = 0x7f8000007f800000;
          auVar143._12_4_ = 0x7f800000;
          auVar143._16_4_ = 0x7f800000;
          auVar143._20_4_ = 0x7f800000;
          auVar143._24_4_ = 0x7f800000;
          auVar143._28_4_ = 0x7f800000;
          auVar87 = vblendmps_avx512vl(auVar143,local_360);
          auVar121._0_4_ =
               (uint)(bVar53 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar53 & 1) * 0x7f800000;
          bVar58 = (bool)(bVar53 >> 1 & 1);
          auVar121._4_4_ = (uint)bVar58 * auVar87._4_4_ | (uint)!bVar58 * 0x7f800000;
          bVar58 = (bool)(bVar53 >> 2 & 1);
          auVar121._8_4_ = (uint)bVar58 * auVar87._8_4_ | (uint)!bVar58 * 0x7f800000;
          bVar58 = (bool)(bVar53 >> 3 & 1);
          auVar121._12_4_ = (uint)bVar58 * auVar87._12_4_ | (uint)!bVar58 * 0x7f800000;
          bVar58 = (bool)(bVar53 >> 4 & 1);
          auVar121._16_4_ = (uint)bVar58 * auVar87._16_4_ | (uint)!bVar58 * 0x7f800000;
          bVar58 = (bool)(bVar53 >> 5 & 1);
          auVar121._20_4_ = (uint)bVar58 * auVar87._20_4_ | (uint)!bVar58 * 0x7f800000;
          bVar58 = (bool)(bVar53 >> 6 & 1);
          auVar121._24_4_ = (uint)bVar58 * auVar87._24_4_ | (uint)!bVar58 * 0x7f800000;
          auVar121._28_4_ =
               (uint)(bVar53 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar53 >> 7) * 0x7f800000;
          auVar87 = vshufps_avx(auVar121,auVar121,0xb1);
          auVar87 = vminps_avx(auVar121,auVar87);
          auVar86 = vshufpd_avx(auVar87,auVar87,5);
          auVar87 = vminps_avx(auVar87,auVar86);
          auVar86 = vpermpd_avx2(auVar87,0x4e);
          auVar87 = vminps_avx(auVar87,auVar86);
          uVar22 = vcmpps_avx512vl(auVar121,auVar87,0);
          bVar51 = (byte)uVar22 & bVar53;
          bVar55 = bVar53;
          if (bVar51 != 0) {
            bVar55 = bVar51;
          }
          iVar1 = 0;
          for (uVar62 = (uint)bVar55; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
            iVar1 = iVar1 + 1;
          }
          aVar6 = (ray->super_RayK<1>).dir.field_0;
          local_5a0._0_16_ = (undefined1  [16])aVar6;
          auVar77 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
          if (auVar77._0_4_ < 0.0) {
            local_8e0[1] = 0;
            local_8e0[0] = bVar53;
            stack0xfffffffffffff722 = auVar89._2_30_;
            local_6c0._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar1 << 2)));
            local_5e0._0_16_ = ZEXT416(*(uint *)(local_2a0 + (uint)(iVar1 << 2)));
            fVar145 = sqrtf(auVar77._0_4_);
            bVar53 = local_8e0[0];
            auVar252 = ZEXT3264(local_720);
            auVar249 = ZEXT3264(local_8c0);
            auVar247 = ZEXT3264(local_8a0);
            auVar246 = ZEXT3264(local_880);
            auVar245 = ZEXT3264(local_860);
            auVar244 = ZEXT3264(local_840);
            auVar243 = ZEXT3264(local_820);
            auVar89 = vmovdqa64_avx512vl(local_800);
            auVar242 = ZEXT3264(auVar89);
            auVar241 = ZEXT3264(local_7e0);
            auVar253 = ZEXT3264(local_7c0);
            auVar250 = ZEXT3264(local_7a0);
            auVar248 = ZEXT3264(local_6e0);
            auVar251 = ZEXT3264(local_700);
            auVar77 = local_6c0._0_16_;
            auVar83 = local_5e0._0_16_;
          }
          else {
            auVar77 = vsqrtss_avx(auVar77,auVar77);
            fVar145 = auVar77._0_4_;
            auVar77 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar1 << 2)));
            auVar83 = ZEXT416(*(uint *)(local_2a0 + (uint)(iVar1 << 2)));
          }
          auVar78 = vminps_avx(local_420._0_16_,local_460._0_16_);
          auVar79 = vmaxps_avx(local_420._0_16_,local_460._0_16_);
          auVar85 = vminps_avx(local_440._0_16_,local_480._0_16_);
          auVar84 = vminps_avx(auVar78,auVar85);
          auVar78 = vmaxps_avx(local_440._0_16_,local_480._0_16_);
          auVar85 = vmaxps_avx(auVar79,auVar78);
          auVar187._8_4_ = 0x7fffffff;
          auVar187._0_8_ = 0x7fffffff7fffffff;
          auVar187._12_4_ = 0x7fffffff;
          auVar79 = vandps_avx(auVar84,auVar187);
          auVar78 = vandps_avx(auVar85,auVar187);
          auVar79 = vmaxps_avx(auVar79,auVar78);
          auVar78 = vmovshdup_avx(auVar79);
          auVar78 = vmaxss_avx(auVar78,auVar79);
          auVar79 = vshufpd_avx(auVar79,auVar79,1);
          auVar79 = vmaxss_avx(auVar79,auVar78);
          local_6a0 = auVar79._0_4_ * 1.9073486e-06;
          local_530 = vshufps_avx(auVar85,auVar85,0xff);
          auVar77 = vinsertps_avx(auVar83,auVar77,0x10);
          auVar209 = ZEXT1664(auVar77);
          lVar57 = 5;
          do {
            do {
              auVar77 = auVar209._0_16_;
              bVar58 = lVar57 == 0;
              lVar57 = lVar57 + -1;
              if (bVar58) goto LAB_01892ef3;
              uVar130 = auVar209._0_4_;
              auVar134._4_4_ = uVar130;
              auVar134._0_4_ = uVar130;
              auVar134._8_4_ = uVar130;
              auVar134._12_4_ = uVar130;
              auVar79 = vfmadd132ps_fma(auVar134,ZEXT816(0) << 0x40,local_5a0._0_16_);
              auVar83 = vmovshdup_avx(auVar77);
              local_4a0._0_16_ = auVar83;
              fVar163 = 1.0 - auVar83._0_4_;
              auVar83 = vshufps_avx(auVar77,auVar77,0x55);
              fVar160 = auVar83._0_4_;
              auVar168._0_4_ = local_460._0_4_ * fVar160;
              fVar161 = auVar83._4_4_;
              auVar168._4_4_ = local_460._4_4_ * fVar161;
              fVar162 = auVar83._8_4_;
              auVar168._8_4_ = local_460._8_4_ * fVar162;
              fVar164 = auVar83._12_4_;
              auVar168._12_4_ = local_460._12_4_ * fVar164;
              local_3a0._0_16_ = ZEXT416((uint)fVar163);
              auVar188._4_4_ = fVar163;
              auVar188._0_4_ = fVar163;
              auVar188._8_4_ = fVar163;
              auVar188._12_4_ = fVar163;
              auVar83 = vfmadd231ps_fma(auVar168,auVar188,local_420._0_16_);
              auVar204._0_4_ = local_440._0_4_ * fVar160;
              auVar204._4_4_ = local_440._4_4_ * fVar161;
              auVar204._8_4_ = local_440._8_4_ * fVar162;
              auVar204._12_4_ = local_440._12_4_ * fVar164;
              auVar78 = vfmadd231ps_fma(auVar204,auVar188,local_460._0_16_);
              auVar214._0_4_ = fVar160 * (float)local_480._0_4_;
              auVar214._4_4_ = fVar161 * (float)local_480._4_4_;
              auVar214._8_4_ = fVar162 * fStack_478;
              auVar214._12_4_ = fVar164 * fStack_474;
              auVar85 = vfmadd231ps_fma(auVar214,auVar188,local_440._0_16_);
              auVar220._0_4_ = fVar160 * auVar78._0_4_;
              auVar220._4_4_ = fVar161 * auVar78._4_4_;
              auVar220._8_4_ = fVar162 * auVar78._8_4_;
              auVar220._12_4_ = fVar164 * auVar78._12_4_;
              auVar83 = vfmadd231ps_fma(auVar220,auVar188,auVar83);
              auVar169._0_4_ = fVar160 * auVar85._0_4_;
              auVar169._4_4_ = fVar161 * auVar85._4_4_;
              auVar169._8_4_ = fVar162 * auVar85._8_4_;
              auVar169._12_4_ = fVar164 * auVar85._12_4_;
              auVar78 = vfmadd231ps_fma(auVar169,auVar188,auVar78);
              auVar205._0_4_ = fVar160 * auVar78._0_4_;
              auVar205._4_4_ = fVar161 * auVar78._4_4_;
              auVar205._8_4_ = fVar162 * auVar78._8_4_;
              auVar205._12_4_ = fVar164 * auVar78._12_4_;
              auVar85 = vfmadd231ps_fma(auVar205,auVar83,auVar188);
              auVar83 = vsubps_avx(auVar78,auVar83);
              auVar25._8_4_ = 0x40400000;
              auVar25._0_8_ = 0x4040000040400000;
              auVar25._12_4_ = 0x40400000;
              auVar78 = vmulps_avx512vl(auVar83,auVar25);
              _local_380 = auVar85;
              auVar79 = vsubps_avx(auVar79,auVar85);
              auVar83 = vdpps_avx(auVar79,auVar79,0x7f);
              local_560._0_16_ = auVar77;
              _local_8e0 = auVar78;
              local_6c0._0_16_ = auVar79;
              local_5e0._0_16_ = auVar83;
              if (auVar83._0_4_ < 0.0) {
                auVar229._0_4_ = sqrtf(auVar83._0_4_);
                auVar229._4_60_ = extraout_var;
                auVar77 = auVar229._0_16_;
                auVar78 = _local_8e0;
              }
              else {
                auVar77 = vsqrtss_avx(auVar83,auVar83);
              }
              local_3c0._0_16_ = vdpps_avx(auVar78,auVar78,0x7f);
              fVar160 = local_3c0._0_4_;
              auVar170._4_12_ = ZEXT812(0) << 0x20;
              auVar170._0_4_ = fVar160;
              local_690 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
              fVar161 = local_690._0_4_;
              local_3e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(local_3c0._0_16_,auVar26);
              auVar83 = vfnmadd213ss_fma(local_3e0._0_16_,local_3c0._0_16_,ZEXT416(0x40000000));
              local_400._0_4_ = auVar83._0_4_;
              local_580._0_4_ = auVar77._0_4_;
              if (fVar160 < auVar79._0_4_) {
                local_770._0_4_ = fVar160 * -0.5;
                auVar232._0_4_ = sqrtf(fVar160);
                auVar232._4_60_ = extraout_var_00;
                auVar77 = ZEXT416((uint)local_580._0_4_);
                auVar83 = auVar232._0_16_;
                fVar160 = (float)local_770._0_4_;
                auVar78 = _local_8e0;
              }
              else {
                auVar83 = vsqrtss_avx512f(local_3c0._0_16_,local_3c0._0_16_);
                fVar160 = fVar160 * -0.5;
              }
              fVar162 = local_690._0_4_;
              fVar160 = fVar161 * 1.5 + fVar160 * fVar162 * fVar162 * fVar162;
              local_690._0_4_ = auVar78._0_4_ * fVar160;
              local_690._4_4_ = auVar78._4_4_ * fVar160;
              local_690._8_4_ = auVar78._8_4_ * fVar160;
              local_690._12_4_ = auVar78._12_4_ * fVar160;
              auVar79 = vdpps_avx(local_6c0._0_16_,local_690,0x7f);
              fVar162 = auVar77._0_4_;
              auVar135._0_4_ = auVar79._0_4_ * auVar79._0_4_;
              auVar135._4_4_ = auVar79._4_4_ * auVar79._4_4_;
              auVar135._8_4_ = auVar79._8_4_ * auVar79._8_4_;
              auVar135._12_4_ = auVar79._12_4_ * auVar79._12_4_;
              auVar85 = vsubps_avx(local_5e0._0_16_,auVar135);
              fVar161 = auVar85._0_4_;
              auVar149._4_12_ = ZEXT812(0) << 0x20;
              auVar149._0_4_ = fVar161;
              auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar149);
              auVar73 = vmulss_avx512f(auVar84,ZEXT416(0x3fc00000));
              auVar68 = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
              if (fVar161 < 0.0) {
                local_510._0_4_ = auVar68._0_4_;
                local_770 = auVar79;
                local_520 = fVar160;
                fStack_51c = fVar160;
                fStack_518 = fVar160;
                fStack_514 = fVar160;
                local_500 = auVar84;
                fVar161 = sqrtf(fVar161);
                auVar68 = ZEXT416((uint)local_510._0_4_);
                auVar73 = ZEXT416(auVar73._0_4_);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar77 = ZEXT416((uint)local_580._0_4_);
                auVar79 = local_770;
                auVar78 = _local_8e0;
                auVar84 = local_500;
                fVar160 = local_520;
                fVar164 = fStack_51c;
                fVar163 = fStack_518;
                fVar165 = fStack_514;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar161 = auVar85._0_4_;
                fVar164 = fVar160;
                fVar163 = fVar160;
                fVar165 = fVar160;
              }
              auVar251 = ZEXT3264(local_700);
              auVar248 = ZEXT3264(local_6e0);
              auVar250 = ZEXT3264(local_7a0);
              auVar253 = ZEXT3264(local_7c0);
              auVar241 = ZEXT3264(local_7e0);
              auVar89 = vmovdqa64_avx512vl(local_800);
              auVar242 = ZEXT3264(auVar89);
              auVar243 = ZEXT3264(local_820);
              auVar244 = ZEXT3264(local_840);
              auVar245 = ZEXT3264(local_860);
              auVar246 = ZEXT3264(local_880);
              auVar247 = ZEXT3264(local_8a0);
              auVar249 = ZEXT3264(local_8c0);
              auVar252 = ZEXT3264(local_720);
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3a0._0_16_,
                                        local_4a0._0_16_);
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4a0._0_16_,
                                        local_3a0._0_16_);
              fVar166 = auVar85._0_4_ * 6.0;
              fVar20 = local_4a0._0_4_ * 6.0;
              auVar189._0_4_ = fVar20 * (float)local_480._0_4_;
              auVar189._4_4_ = fVar20 * (float)local_480._4_4_;
              auVar189._8_4_ = fVar20 * fStack_478;
              auVar189._12_4_ = fVar20 * fStack_474;
              auVar171._4_4_ = fVar166;
              auVar171._0_4_ = fVar166;
              auVar171._8_4_ = fVar166;
              auVar171._12_4_ = fVar166;
              auVar85 = vfmadd132ps_fma(auVar171,auVar189,local_440._0_16_);
              fVar166 = auVar69._0_4_ * 6.0;
              auVar150._4_4_ = fVar166;
              auVar150._0_4_ = fVar166;
              auVar150._8_4_ = fVar166;
              auVar150._12_4_ = fVar166;
              auVar85 = vfmadd132ps_fma(auVar150,auVar85,local_460._0_16_);
              fVar166 = local_3a0._0_4_ * 6.0;
              auVar172._4_4_ = fVar166;
              auVar172._0_4_ = fVar166;
              auVar172._8_4_ = fVar166;
              auVar172._12_4_ = fVar166;
              auVar85 = vfmadd132ps_fma(auVar172,auVar85,local_420._0_16_);
              auVar151._0_4_ = auVar85._0_4_ * (float)local_3c0._0_4_;
              auVar151._4_4_ = auVar85._4_4_ * (float)local_3c0._0_4_;
              auVar151._8_4_ = auVar85._8_4_ * (float)local_3c0._0_4_;
              auVar151._12_4_ = auVar85._12_4_ * (float)local_3c0._0_4_;
              auVar85 = vdpps_avx(auVar78,auVar85,0x7f);
              fVar166 = auVar85._0_4_;
              auVar173._0_4_ = auVar78._0_4_ * fVar166;
              auVar173._4_4_ = auVar78._4_4_ * fVar166;
              auVar173._8_4_ = auVar78._8_4_ * fVar166;
              auVar173._12_4_ = auVar78._12_4_ * fVar166;
              auVar85 = vsubps_avx(auVar151,auVar173);
              fVar166 = (float)local_400._0_4_ * (float)local_3e0._0_4_;
              auVar69 = vmaxss_avx(ZEXT416((uint)local_6a0),
                                   ZEXT416((uint)(local_560._0_4_ * fVar145 * 1.9073486e-06)));
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar71 = vxorps_avx512vl(auVar78,auVar27);
              auVar174._0_4_ = fVar160 * auVar85._0_4_ * fVar166;
              auVar174._4_4_ = fVar164 * auVar85._4_4_ * fVar166;
              auVar174._8_4_ = fVar163 * auVar85._8_4_ * fVar166;
              auVar174._12_4_ = fVar165 * auVar85._12_4_ * fVar166;
              auVar85 = vdpps_avx(auVar71,local_690,0x7f);
              auVar70 = vdivss_avx512f(ZEXT416((uint)local_6a0),auVar83);
              auVar83 = vfmadd213ss_fma(auVar77,ZEXT416((uint)local_6a0),auVar69);
              auVar77 = vdpps_avx(local_6c0._0_16_,auVar174,0x7f);
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(fVar162 + 1.0)),auVar70,auVar83);
              fVar160 = auVar85._0_4_ + auVar77._0_4_;
              auVar77 = vdpps_avx(local_5a0._0_16_,local_690,0x7f);
              auVar83 = vdpps_avx(local_6c0._0_16_,auVar71,0x7f);
              auVar85 = vmulss_avx512f(auVar68,auVar84);
              auVar84 = vmulss_avx512f(auVar84,auVar84);
              auVar68 = vaddss_avx512f(auVar73,ZEXT416((uint)(auVar85._0_4_ * auVar84._0_4_)));
              auVar85 = vdpps_avx(local_6c0._0_16_,local_5a0._0_16_,0x7f);
              auVar73 = vfnmadd231ss_fma(auVar83,auVar79,ZEXT416((uint)fVar160));
              auVar85 = vfnmadd231ss_fma(auVar85,auVar79,auVar77);
              auVar83 = vpermilps_avx(_local_380,0xff);
              fVar161 = fVar161 - auVar83._0_4_;
              auVar84 = vshufps_avx(auVar78,auVar78,0xff);
              auVar83 = vfmsub213ss_fma(auVar73,auVar68,auVar84);
              auVar225._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
              auVar225._8_4_ = auVar83._8_4_ ^ 0x80000000;
              auVar225._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar85 = ZEXT416((uint)(auVar85._0_4_ * auVar68._0_4_));
              auVar73 = vfmsub231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar83._0_4_)),
                                        ZEXT416((uint)fVar160),auVar85);
              auVar83 = vinsertps_avx(auVar225,auVar85,0x1c);
              auVar215._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
              auVar215._8_4_ = auVar77._8_4_ ^ 0x80000000;
              auVar215._12_4_ = auVar77._12_4_ ^ 0x80000000;
              auVar85 = vinsertps_avx(ZEXT416((uint)fVar160),auVar215,0x10);
              auVar190._0_4_ = auVar73._0_4_;
              auVar190._4_4_ = auVar190._0_4_;
              auVar190._8_4_ = auVar190._0_4_;
              auVar190._12_4_ = auVar190._0_4_;
              auVar77 = vdivps_avx(auVar83,auVar190);
              auVar83 = vdivps_avx(auVar85,auVar190);
              auVar85 = vbroadcastss_avx512vl(auVar79);
              auVar191._0_4_ = auVar85._0_4_ * auVar77._0_4_ + fVar161 * auVar83._0_4_;
              auVar191._4_4_ = auVar85._4_4_ * auVar77._4_4_ + fVar161 * auVar83._4_4_;
              auVar191._8_4_ = auVar85._8_4_ * auVar77._8_4_ + fVar161 * auVar83._8_4_;
              auVar191._12_4_ = auVar85._12_4_ * auVar77._12_4_ + fVar161 * auVar83._12_4_;
              auVar77 = vsubps_avx(local_560._0_16_,auVar191);
              auVar209 = ZEXT1664(auVar77);
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar83 = vandps_avx512vl(auVar79,auVar28);
            } while (auVar70._0_4_ <= auVar83._0_4_);
            auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar70._0_4_ + auVar69._0_4_)),local_530,
                                      ZEXT416(0x36000000));
            auVar29._8_4_ = 0x7fffffff;
            auVar29._0_8_ = 0x7fffffff7fffffff;
            auVar29._12_4_ = 0x7fffffff;
            auVar79 = vandps_avx512vl(ZEXT416((uint)fVar161),auVar29);
          } while (auVar83._0_4_ <= auVar79._0_4_);
          fVar145 = auVar77._0_4_ + (float)local_540._0_4_;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar145) &&
             (fVar160 = (ray->super_RayK<1>).tfar, fVar145 <= fVar160)) {
            auVar77 = vmovshdup_avx(auVar77);
            fVar161 = auVar77._0_4_;
            if ((0.0 <= fVar161) && (fVar161 <= 1.0)) {
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5e0._0_4_));
              fVar162 = auVar77._0_4_;
              pGVar8 = (context->scene->geometries).items[local_8f0].ptr;
              if ((pGVar8->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar162 = fVar162 * 1.5 + local_5e0._0_4_ * -0.5 * fVar162 * fVar162 * fVar162;
                auVar192._0_4_ = local_6c0._0_4_ * fVar162;
                auVar192._4_4_ = local_6c0._4_4_ * fVar162;
                auVar192._8_4_ = local_6c0._8_4_ * fVar162;
                auVar192._12_4_ = local_6c0._12_4_ * fVar162;
                auVar85 = vfmadd213ps_fma(auVar84,auVar192,auVar78);
                auVar77 = vshufps_avx(auVar192,auVar192,0xc9);
                auVar83 = vshufps_avx(auVar78,auVar78,0xc9);
                auVar193._0_4_ = auVar192._0_4_ * auVar83._0_4_;
                auVar193._4_4_ = auVar192._4_4_ * auVar83._4_4_;
                auVar193._8_4_ = auVar192._8_4_ * auVar83._8_4_;
                auVar193._12_4_ = auVar192._12_4_ * auVar83._12_4_;
                auVar79 = vfmsub231ps_fma(auVar193,auVar78,auVar77);
                auVar77 = vshufps_avx(auVar79,auVar79,0xc9);
                auVar83 = vshufps_avx(auVar85,auVar85,0xc9);
                auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
                auVar136._0_4_ = auVar85._0_4_ * auVar79._0_4_;
                auVar136._4_4_ = auVar85._4_4_ * auVar79._4_4_;
                auVar136._8_4_ = auVar85._8_4_ * auVar79._8_4_;
                auVar136._12_4_ = auVar85._12_4_ * auVar79._12_4_;
                auVar83 = vfmsub231ps_fma(auVar136,auVar77,auVar83);
                auVar77 = vshufps_avx(auVar83,auVar83,0xe9);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar145;
                  uVar22 = vmovlps_avx(auVar77);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar22;
                  (ray->Ng).field_0.field_0.z = auVar83._0_4_;
                  ray->u = fVar161;
                  ray->v = 0.0;
                  ray->primID = (uint)local_8e8;
                  ray->geomID = (uint)local_8f0;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_8e0._0_4_ = fVar160;
                  local_680 = vmovlps_avx(auVar77);
                  local_678 = auVar83._0_4_;
                  local_674 = fVar161;
                  local_670 = 0;
                  local_66c = (uint)local_8e8;
                  local_668 = (uint)local_8f0;
                  local_664 = context->user->instID[0];
                  local_660 = context->user->instPrimID[0];
                  (ray->super_RayK<1>).tfar = fVar145;
                  local_8f4 = -1;
                  local_758.valid = &local_8f4;
                  local_758.geometryUserPtr = pGVar8->userPtr;
                  local_758.context = context->user;
                  local_758.ray = (RTCRayN *)ray;
                  local_758.hit = (RTCHitN *)&local_680;
                  local_758.N = 1;
                  if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0189305f:
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_758);
                      auVar252 = ZEXT3264(local_720);
                      auVar249 = ZEXT3264(local_8c0);
                      auVar247 = ZEXT3264(local_8a0);
                      auVar246 = ZEXT3264(local_880);
                      auVar245 = ZEXT3264(local_860);
                      auVar244 = ZEXT3264(local_840);
                      auVar243 = ZEXT3264(local_820);
                      auVar89 = vmovdqa64_avx512vl(local_800);
                      auVar242 = ZEXT3264(auVar89);
                      auVar241 = ZEXT3264(local_7e0);
                      auVar253 = ZEXT3264(local_7c0);
                      auVar250 = ZEXT3264(local_7a0);
                      auVar248 = ZEXT3264(local_6e0);
                      auVar251 = ZEXT3264(local_700);
                      if (*local_758.valid == 0) goto LAB_01893167;
                    }
                    (((Vec3f *)((long)local_758.ray + 0x30))->field_0).components[0] =
                         *(float *)local_758.hit;
                    (((Vec3f *)((long)local_758.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_758.hit + 4);
                    (((Vec3f *)((long)local_758.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_758.hit + 8);
                    *(float *)((long)local_758.ray + 0x3c) = *(float *)(local_758.hit + 0xc);
                    *(float *)((long)local_758.ray + 0x40) = *(float *)(local_758.hit + 0x10);
                    *(float *)((long)local_758.ray + 0x44) = *(float *)(local_758.hit + 0x14);
                    *(float *)((long)local_758.ray + 0x48) = *(float *)(local_758.hit + 0x18);
                    *(float *)((long)local_758.ray + 0x4c) = *(float *)(local_758.hit + 0x1c);
                    *(float *)((long)local_758.ray + 0x50) = *(float *)(local_758.hit + 0x20);
                  }
                  else {
                    (*pGVar8->intersectionFilterN)(&local_758);
                    auVar252 = ZEXT3264(local_720);
                    auVar249 = ZEXT3264(local_8c0);
                    auVar247 = ZEXT3264(local_8a0);
                    auVar246 = ZEXT3264(local_880);
                    auVar245 = ZEXT3264(local_860);
                    auVar244 = ZEXT3264(local_840);
                    auVar243 = ZEXT3264(local_820);
                    auVar89 = vmovdqa64_avx512vl(local_800);
                    auVar242 = ZEXT3264(auVar89);
                    auVar241 = ZEXT3264(local_7e0);
                    auVar253 = ZEXT3264(local_7c0);
                    auVar250 = ZEXT3264(local_7a0);
                    auVar248 = ZEXT3264(local_6e0);
                    auVar251 = ZEXT3264(local_700);
                    if (*local_758.valid != 0) goto LAB_0189305f;
LAB_01893167:
                    (ray->super_RayK<1>).tfar = (float)local_8e0._0_4_;
                  }
                }
              }
            }
          }
LAB_01892ef3:
          auVar48._4_4_ = fStack_2fc;
          auVar48._0_4_ = local_300;
          auVar48._8_4_ = fStack_2f8;
          auVar48._12_4_ = fStack_2f4;
          auVar48._16_4_ = fStack_2f0;
          auVar48._20_4_ = fStack_2ec;
          auVar48._24_4_ = fStack_2e8;
          auVar48._28_4_ = fStack_2e4;
          fVar145 = (ray->super_RayK<1>).tfar;
          auVar36._4_4_ = fVar145;
          auVar36._0_4_ = fVar145;
          auVar36._8_4_ = fVar145;
          auVar36._12_4_ = fVar145;
          auVar36._16_4_ = fVar145;
          auVar36._20_4_ = fVar145;
          auVar36._24_4_ = fVar145;
          auVar36._28_4_ = fVar145;
          uVar22 = vcmpps_avx512vl(auVar48,auVar36,2);
        }
        auVar158._0_4_ = (float)local_340._0_4_ + (float)local_320._0_4_;
        auVar158._4_4_ = (float)local_340._4_4_ + (float)local_320._4_4_;
        auVar158._8_4_ = fStack_338 + fStack_318;
        auVar158._12_4_ = fStack_334 + fStack_314;
        auVar158._16_4_ = fStack_330 + fStack_310;
        auVar158._20_4_ = fStack_32c + fStack_30c;
        auVar158._24_4_ = fStack_328 + fStack_308;
        auVar158._28_4_ = fStack_324 + fStack_304;
        fVar160 = (ray->super_RayK<1>).tfar;
        fVar145 = (ray->super_RayK<1>).tfar;
        auVar37._4_4_ = fVar145;
        auVar37._0_4_ = fVar145;
        auVar37._8_4_ = fVar145;
        auVar37._12_4_ = fVar145;
        auVar37._16_4_ = fVar145;
        auVar37._20_4_ = fVar145;
        auVar37._24_4_ = fVar145;
        auVar37._28_4_ = fVar145;
        uVar22 = vcmpps_avx512vl(auVar158,auVar37,2);
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar89 = vpblendmd_avx512vl(auVar159,auVar38);
        bVar58 = (bool)((byte)local_728 & 1);
        local_320._0_4_ = (uint)bVar58 * auVar89._0_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)((byte)(local_728 >> 1) & 1);
        local_320._4_4_ = (uint)bVar58 * auVar89._4_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)((byte)(local_728 >> 2) & 1);
        fStack_318 = (float)((uint)bVar58 * auVar89._8_4_ | (uint)!bVar58 * 2);
        bVar58 = (bool)((byte)(local_728 >> 3) & 1);
        fStack_314 = (float)((uint)bVar58 * auVar89._12_4_ | (uint)!bVar58 * 2);
        bVar58 = (bool)((byte)(local_728 >> 4) & 1);
        fStack_310 = (float)((uint)bVar58 * auVar89._16_4_ | (uint)!bVar58 * 2);
        bVar58 = (bool)((byte)(local_728 >> 5) & 1);
        fStack_30c = (float)((uint)bVar58 * auVar89._20_4_ | (uint)!bVar58 * 2);
        bVar58 = (bool)((byte)(local_728 >> 6) & 1);
        fStack_308 = (float)((uint)bVar58 * auVar89._24_4_ | (uint)!bVar58 * 2);
        bVar58 = (bool)((byte)(local_728 >> 7) & 1);
        fStack_304 = (float)((uint)bVar58 * auVar89._28_4_ | (uint)!bVar58 * 2);
        bVar50 = (byte)uVar23 & bVar50 & (byte)uVar22;
        uVar22 = vpcmpd_avx512vl(_local_320,local_2c0,2);
        local_360 = _local_260;
        local_300 = (float)local_340._0_4_ + (float)local_260._0_4_;
        fStack_2fc = (float)local_340._4_4_ + (float)local_260._4_4_;
        fStack_2f8 = fStack_338 + fStack_258;
        fStack_2f4 = fStack_334 + fStack_254;
        fStack_2f0 = fStack_330 + fStack_250;
        fStack_2ec = fStack_32c + fStack_24c;
        fStack_2e8 = fStack_328 + fStack_248;
        fStack_2e4 = fStack_324 + fStack_244;
        auVar232 = ZEXT3264(local_600);
        auVar236 = ZEXT3264(local_620);
        auVar229 = ZEXT3264(local_5c0);
        auVar239 = ZEXT3264(local_640);
        for (bVar55 = (byte)uVar22 & bVar50; auVar89 = _local_8e0, auVar223 = ZEXT3264(local_4c0),
            bVar55 != 0; bVar55 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar55 & (byte)uVar22) {
          auVar144._8_4_ = 0x7f800000;
          auVar144._0_8_ = 0x7f8000007f800000;
          auVar144._12_4_ = 0x7f800000;
          auVar144._16_4_ = 0x7f800000;
          auVar144._20_4_ = 0x7f800000;
          auVar144._24_4_ = 0x7f800000;
          auVar144._28_4_ = 0x7f800000;
          auVar87 = vblendmps_avx512vl(auVar144,local_360);
          auVar122._0_4_ =
               (uint)(bVar55 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar55 & 1) * 0x7f800000;
          bVar58 = (bool)(bVar55 >> 1 & 1);
          auVar122._4_4_ = (uint)bVar58 * auVar87._4_4_ | (uint)!bVar58 * 0x7f800000;
          bVar58 = (bool)(bVar55 >> 2 & 1);
          auVar122._8_4_ = (uint)bVar58 * auVar87._8_4_ | (uint)!bVar58 * 0x7f800000;
          bVar58 = (bool)(bVar55 >> 3 & 1);
          auVar122._12_4_ = (uint)bVar58 * auVar87._12_4_ | (uint)!bVar58 * 0x7f800000;
          bVar58 = (bool)(bVar55 >> 4 & 1);
          auVar122._16_4_ = (uint)bVar58 * auVar87._16_4_ | (uint)!bVar58 * 0x7f800000;
          bVar58 = (bool)(bVar55 >> 5 & 1);
          auVar122._20_4_ = (uint)bVar58 * auVar87._20_4_ | (uint)!bVar58 * 0x7f800000;
          bVar58 = (bool)(bVar55 >> 6 & 1);
          auVar122._24_4_ = (uint)bVar58 * auVar87._24_4_ | (uint)!bVar58 * 0x7f800000;
          auVar122._28_4_ =
               (uint)(bVar55 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar55 >> 7) * 0x7f800000;
          auVar87 = vshufps_avx(auVar122,auVar122,0xb1);
          auVar87 = vminps_avx(auVar122,auVar87);
          auVar86 = vshufpd_avx(auVar87,auVar87,5);
          auVar87 = vminps_avx(auVar87,auVar86);
          auVar86 = vpermpd_avx2(auVar87,0x4e);
          auVar87 = vminps_avx(auVar87,auVar86);
          uVar22 = vcmpps_avx512vl(auVar122,auVar87,0);
          bVar51 = (byte)uVar22 & bVar55;
          bVar53 = bVar55;
          if (bVar51 != 0) {
            bVar53 = bVar51;
          }
          iVar1 = 0;
          for (uVar62 = (uint)bVar53; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
            iVar1 = iVar1 + 1;
          }
          aVar6 = (ray->super_RayK<1>).dir.field_0;
          local_5e0._0_16_ = (undefined1  [16])aVar6;
          auVar77 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
          if (auVar77._0_4_ < 0.0) {
            local_8e0[1] = 0;
            local_8e0[0] = bVar55;
            stack0xfffffffffffff722 = auVar89._2_30_;
            local_6c0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar1 << 2)));
            local_5a0._0_16_ = ZEXT416(*(uint *)(local_240 + (uint)(iVar1 << 2)));
            fVar145 = sqrtf(auVar77._0_4_);
            bVar55 = local_8e0[0];
            auVar252 = ZEXT3264(local_720);
            auVar249 = ZEXT3264(local_8c0);
            auVar247 = ZEXT3264(local_8a0);
            auVar246 = ZEXT3264(local_880);
            auVar245 = ZEXT3264(local_860);
            auVar244 = ZEXT3264(local_840);
            auVar243 = ZEXT3264(local_820);
            auVar89 = vmovdqa64_avx512vl(local_800);
            auVar242 = ZEXT3264(auVar89);
            auVar241 = ZEXT3264(local_7e0);
            auVar253 = ZEXT3264(local_7c0);
            auVar239 = ZEXT3264(local_640);
            auVar229 = ZEXT3264(local_5c0);
            auVar236 = ZEXT3264(local_620);
            auVar232 = ZEXT3264(local_600);
            auVar250 = ZEXT3264(local_7a0);
            auVar248 = ZEXT3264(local_6e0);
            auVar251 = ZEXT3264(local_700);
            auVar77 = local_6c0._0_16_;
            auVar83 = local_5a0._0_16_;
          }
          else {
            auVar77 = vsqrtss_avx(auVar77,auVar77);
            fVar145 = auVar77._0_4_;
            auVar77 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar1 << 2)));
            auVar83 = ZEXT416(*(uint *)(local_240 + (uint)(iVar1 << 2)));
          }
          auVar78 = vminps_avx(local_420._0_16_,local_460._0_16_);
          auVar79 = vmaxps_avx(local_420._0_16_,local_460._0_16_);
          auVar85 = vminps_avx(local_440._0_16_,local_480._0_16_);
          auVar84 = vminps_avx(auVar78,auVar85);
          auVar78 = vmaxps_avx(local_440._0_16_,local_480._0_16_);
          auVar85 = vmaxps_avx(auVar79,auVar78);
          auVar194._8_4_ = 0x7fffffff;
          auVar194._0_8_ = 0x7fffffff7fffffff;
          auVar194._12_4_ = 0x7fffffff;
          auVar79 = vandps_avx(auVar84,auVar194);
          auVar78 = vandps_avx(auVar85,auVar194);
          auVar79 = vmaxps_avx(auVar79,auVar78);
          auVar78 = vmovshdup_avx(auVar79);
          auVar78 = vmaxss_avx(auVar78,auVar79);
          auVar79 = vshufpd_avx(auVar79,auVar79,1);
          auVar79 = vmaxss_avx(auVar79,auVar78);
          fVar160 = auVar79._0_4_ * 1.9073486e-06;
          local_530 = vshufps_avx(auVar85,auVar85,0xff);
          auVar77 = vinsertps_avx(auVar83,auVar77,0x10);
          auVar209 = ZEXT1664(auVar77);
          lVar57 = 5;
          do {
            do {
              auVar77 = auVar209._0_16_;
              bVar58 = lVar57 == 0;
              lVar57 = lVar57 + -1;
              if (bVar58) goto LAB_01893ac3;
              uVar130 = auVar209._0_4_;
              auVar137._4_4_ = uVar130;
              auVar137._0_4_ = uVar130;
              auVar137._8_4_ = uVar130;
              auVar137._12_4_ = uVar130;
              auVar79 = vfmadd132ps_fma(auVar137,ZEXT816(0) << 0x40,local_5e0._0_16_);
              auVar83 = vmovshdup_avx(auVar77);
              local_3c0._0_16_ = auVar83;
              fVar165 = 1.0 - auVar83._0_4_;
              auVar83 = vshufps_avx(auVar77,auVar77,0x55);
              fVar161 = auVar83._0_4_;
              auVar175._0_4_ = local_460._0_4_ * fVar161;
              fVar162 = auVar83._4_4_;
              auVar175._4_4_ = local_460._4_4_ * fVar162;
              fVar164 = auVar83._8_4_;
              auVar175._8_4_ = local_460._8_4_ * fVar164;
              fVar163 = auVar83._12_4_;
              auVar175._12_4_ = local_460._12_4_ * fVar163;
              local_3a0._0_16_ = ZEXT416((uint)fVar165);
              auVar195._4_4_ = fVar165;
              auVar195._0_4_ = fVar165;
              auVar195._8_4_ = fVar165;
              auVar195._12_4_ = fVar165;
              auVar83 = vfmadd231ps_fma(auVar175,auVar195,local_420._0_16_);
              auVar206._0_4_ = local_440._0_4_ * fVar161;
              auVar206._4_4_ = local_440._4_4_ * fVar162;
              auVar206._8_4_ = local_440._8_4_ * fVar164;
              auVar206._12_4_ = local_440._12_4_ * fVar163;
              auVar78 = vfmadd231ps_fma(auVar206,auVar195,local_460._0_16_);
              auVar216._0_4_ = fVar161 * (float)local_480._0_4_;
              auVar216._4_4_ = fVar162 * (float)local_480._4_4_;
              auVar216._8_4_ = fVar164 * fStack_478;
              auVar216._12_4_ = fVar163 * fStack_474;
              auVar85 = vfmadd231ps_fma(auVar216,auVar195,local_440._0_16_);
              auVar221._0_4_ = fVar161 * auVar78._0_4_;
              auVar221._4_4_ = fVar162 * auVar78._4_4_;
              auVar221._8_4_ = fVar164 * auVar78._8_4_;
              auVar221._12_4_ = fVar163 * auVar78._12_4_;
              auVar83 = vfmadd231ps_fma(auVar221,auVar195,auVar83);
              auVar176._0_4_ = fVar161 * auVar85._0_4_;
              auVar176._4_4_ = fVar162 * auVar85._4_4_;
              auVar176._8_4_ = fVar164 * auVar85._8_4_;
              auVar176._12_4_ = fVar163 * auVar85._12_4_;
              auVar78 = vfmadd231ps_fma(auVar176,auVar195,auVar78);
              auVar207._0_4_ = fVar161 * auVar78._0_4_;
              auVar207._4_4_ = fVar162 * auVar78._4_4_;
              auVar207._8_4_ = fVar164 * auVar78._8_4_;
              auVar207._12_4_ = fVar163 * auVar78._12_4_;
              auVar85 = vfmadd231ps_fma(auVar207,auVar83,auVar195);
              auVar83 = vsubps_avx(auVar78,auVar83);
              auVar30._8_4_ = 0x40400000;
              auVar30._0_8_ = 0x4040000040400000;
              auVar30._12_4_ = 0x40400000;
              auVar78 = vmulps_avx512vl(auVar83,auVar30);
              _local_380 = auVar85;
              auVar83 = vsubps_avx(auVar79,auVar85);
              _local_8e0 = auVar83;
              auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
              local_5a0._0_16_ = auVar83;
              local_560._0_16_ = auVar77;
              local_6c0._0_16_ = auVar78;
              if (auVar83._0_4_ < 0.0) {
                auVar236._0_4_ = sqrtf(auVar83._0_4_);
                auVar236._4_60_ = extraout_var_01;
                auVar77 = auVar236._0_16_;
                auVar78 = local_6c0._0_16_;
              }
              else {
                auVar77 = vsqrtss_avx(auVar83,auVar83);
              }
              local_3e0._0_16_ = vdpps_avx(auVar78,auVar78,0x7f);
              fVar161 = local_3e0._0_4_;
              auVar177._4_12_ = ZEXT812(0) << 0x20;
              auVar177._0_4_ = fVar161;
              local_580._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              local_6a0 = local_580._0_4_ * 1.5;
              local_400._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(local_3e0._0_16_,auVar31);
              auVar83 = vfnmadd213ss_fma(local_400._0_16_,local_3e0._0_16_,ZEXT416(0x40000000));
              local_690._0_4_ = auVar83._0_4_;
              local_4a0._0_4_ = auVar77._0_4_;
              if (fVar161 < auVar79._0_4_) {
                local_770._0_4_ = fVar161 * -0.5;
                fVar162 = sqrtf(fVar161);
                auVar77 = ZEXT416((uint)local_4a0._0_4_);
                fVar161 = (float)local_770._0_4_;
                auVar78 = local_6c0._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(local_3e0._0_16_,local_3e0._0_16_);
                fVar162 = auVar83._0_4_;
                fVar161 = fVar161 * -0.5;
              }
              fVar164 = local_580._0_4_;
              local_6a0 = local_6a0 + fVar161 * fVar164 * fVar164 * fVar164;
              fStack_69c = local_6a0;
              fStack_698 = local_6a0;
              fStack_694 = local_6a0;
              auVar240._0_4_ = auVar78._0_4_ * local_6a0;
              auVar240._4_4_ = auVar78._4_4_ * local_6a0;
              auVar240._8_4_ = auVar78._8_4_ * local_6a0;
              auVar240._12_4_ = auVar78._12_4_ * local_6a0;
              local_580._0_16_ = vdpps_avx(auVar240,_local_8e0,0x7f);
              auVar85 = vaddss_avx512f(auVar77,ZEXT416(0x3f800000));
              auVar138._0_4_ = local_580._0_4_ * local_580._0_4_;
              auVar138._4_4_ = local_580._4_4_ * local_580._4_4_;
              auVar138._8_4_ = local_580._8_4_ * local_580._8_4_;
              auVar138._12_4_ = local_580._12_4_ * local_580._12_4_;
              auVar83 = vsubps_avx(local_5a0._0_16_,auVar138);
              fVar161 = auVar83._0_4_;
              auVar152._4_12_ = ZEXT812(0) << 0x20;
              auVar152._0_4_ = fVar161;
              auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar152);
              auVar84 = vmulss_avx512f(auVar79,ZEXT416(0x3fc00000));
              auVar73 = vmulss_avx512f(auVar83,ZEXT416(0xbf000000));
              uVar60 = fVar161 == 0.0;
              uVar59 = fVar161 < 0.0;
              if ((bool)uVar59) {
                local_770._0_4_ = auVar85._0_4_;
                local_520 = auVar73._0_4_;
                local_510 = auVar240;
                local_500 = auVar79;
                fVar161 = sqrtf(fVar161);
                auVar73 = ZEXT416((uint)local_520);
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar77 = ZEXT416((uint)local_4a0._0_4_);
                auVar85 = ZEXT416((uint)local_770._0_4_);
                auVar240 = local_510;
                auVar79 = local_500;
                auVar78 = local_6c0._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                fVar161 = auVar83._0_4_;
              }
              auVar251 = ZEXT3264(local_700);
              auVar248 = ZEXT3264(local_6e0);
              auVar250 = ZEXT3264(local_7a0);
              auVar232 = ZEXT3264(local_600);
              auVar236 = ZEXT3264(local_620);
              auVar239 = ZEXT3264(local_640);
              auVar253 = ZEXT3264(local_7c0);
              auVar241 = ZEXT3264(local_7e0);
              auVar89 = vmovdqa64_avx512vl(local_800);
              auVar242 = ZEXT3264(auVar89);
              auVar243 = ZEXT3264(local_820);
              auVar244 = ZEXT3264(local_840);
              auVar245 = ZEXT3264(local_860);
              auVar246 = ZEXT3264(local_880);
              auVar247 = ZEXT3264(local_8a0);
              auVar249 = ZEXT3264(local_8c0);
              auVar252 = ZEXT3264(local_720);
              auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3a0._0_16_,
                                        local_3c0._0_16_);
              auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3c0._0_16_,
                                        local_3a0._0_16_);
              fVar164 = auVar83._0_4_ * 6.0;
              fVar163 = local_3c0._0_4_ * 6.0;
              auVar196._0_4_ = fVar163 * (float)local_480._0_4_;
              auVar196._4_4_ = fVar163 * (float)local_480._4_4_;
              auVar196._8_4_ = fVar163 * fStack_478;
              auVar196._12_4_ = fVar163 * fStack_474;
              auVar178._4_4_ = fVar164;
              auVar178._0_4_ = fVar164;
              auVar178._8_4_ = fVar164;
              auVar178._12_4_ = fVar164;
              auVar83 = vfmadd132ps_fma(auVar178,auVar196,local_440._0_16_);
              fVar164 = auVar68._0_4_ * 6.0;
              auVar153._4_4_ = fVar164;
              auVar153._0_4_ = fVar164;
              auVar153._8_4_ = fVar164;
              auVar153._12_4_ = fVar164;
              auVar83 = vfmadd132ps_fma(auVar153,auVar83,local_460._0_16_);
              fVar164 = local_3a0._0_4_ * 6.0;
              auVar179._4_4_ = fVar164;
              auVar179._0_4_ = fVar164;
              auVar179._8_4_ = fVar164;
              auVar179._12_4_ = fVar164;
              auVar83 = vfmadd132ps_fma(auVar179,auVar83,local_420._0_16_);
              auVar154._0_4_ = auVar83._0_4_ * (float)local_3e0._0_4_;
              auVar154._4_4_ = auVar83._4_4_ * (float)local_3e0._0_4_;
              auVar154._8_4_ = auVar83._8_4_ * (float)local_3e0._0_4_;
              auVar154._12_4_ = auVar83._12_4_ * (float)local_3e0._0_4_;
              auVar83 = vdpps_avx(auVar78,auVar83,0x7f);
              fVar164 = auVar83._0_4_;
              auVar180._0_4_ = auVar78._0_4_ * fVar164;
              auVar180._4_4_ = auVar78._4_4_ * fVar164;
              auVar180._8_4_ = auVar78._8_4_ * fVar164;
              auVar180._12_4_ = auVar78._12_4_ * fVar164;
              auVar83 = vsubps_avx(auVar154,auVar180);
              fVar164 = (float)local_690._0_4_ * (float)local_400._0_4_;
              auVar68 = vmaxss_avx(ZEXT416((uint)fVar160),
                                   ZEXT416((uint)(local_560._0_4_ * fVar145 * 1.9073486e-06)));
              auVar32._8_4_ = 0x80000000;
              auVar32._0_8_ = 0x8000000080000000;
              auVar32._12_4_ = 0x80000000;
              auVar70 = vxorps_avx512vl(auVar78,auVar32);
              auVar181._0_4_ = auVar83._0_4_ * fVar164 * local_6a0;
              auVar181._4_4_ = auVar83._4_4_ * fVar164 * fStack_69c;
              auVar181._8_4_ = auVar83._8_4_ * fVar164 * fStack_698;
              auVar181._12_4_ = auVar83._12_4_ * fVar164 * fStack_694;
              auVar83 = vdpps_avx(auVar70,auVar240,0x7f);
              auVar69 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar160),auVar68);
              auVar77 = vdpps_avx(_local_8e0,auVar181,0x7f);
              vfmadd213ss_avx512f(auVar85,ZEXT416((uint)(fVar160 / fVar162)),auVar69);
              fVar162 = auVar83._0_4_ + auVar77._0_4_;
              auVar77 = vdpps_avx(local_5e0._0_16_,auVar240,0x7f);
              auVar83 = vdpps_avx(_local_8e0,auVar70,0x7f);
              auVar85 = vmulss_avx512f(auVar73,auVar79);
              auVar79 = vmulss_avx512f(auVar79,auVar79);
              auVar84 = vaddss_avx512f(auVar84,ZEXT416((uint)(auVar85._0_4_ * auVar79._0_4_)));
              auVar79 = vdpps_avx(_local_8e0,local_5e0._0_16_,0x7f);
              auVar73 = vfnmadd231ss_avx512f(auVar83,local_580._0_16_,ZEXT416((uint)fVar162));
              auVar79 = vfnmadd231ss_avx512f(auVar79,local_580._0_16_,auVar77);
              auVar83 = vpermilps_avx(_local_380,0xff);
              fVar161 = fVar161 - auVar83._0_4_;
              auVar85 = vshufps_avx(auVar78,auVar78,0xff);
              auVar83 = vfmsub213ss_fma(auVar73,auVar84,auVar85);
              auVar226._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
              auVar226._8_4_ = auVar83._8_4_ ^ 0x80000000;
              auVar226._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar79 = ZEXT416((uint)(auVar79._0_4_ * auVar84._0_4_));
              auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar83._0_4_)),
                                        ZEXT416((uint)fVar162),auVar79);
              auVar83 = vinsertps_avx(auVar226,auVar79,0x1c);
              auVar217._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
              auVar217._8_4_ = auVar77._8_4_ ^ 0x80000000;
              auVar217._12_4_ = auVar77._12_4_ ^ 0x80000000;
              auVar79 = vinsertps_avx(ZEXT416((uint)fVar162),auVar217,0x10);
              auVar197._0_4_ = auVar84._0_4_;
              auVar197._4_4_ = auVar197._0_4_;
              auVar197._8_4_ = auVar197._0_4_;
              auVar197._12_4_ = auVar197._0_4_;
              auVar77 = vdivps_avx(auVar83,auVar197);
              auVar83 = vdivps_avx(auVar79,auVar197);
              auVar79 = vbroadcastss_avx512vl(local_580._0_16_);
              auVar198._0_4_ = auVar79._0_4_ * auVar77._0_4_ + fVar161 * auVar83._0_4_;
              auVar198._4_4_ = auVar79._4_4_ * auVar77._4_4_ + fVar161 * auVar83._4_4_;
              auVar198._8_4_ = auVar79._8_4_ * auVar77._8_4_ + fVar161 * auVar83._8_4_;
              auVar198._12_4_ = auVar79._12_4_ * auVar77._12_4_ + fVar161 * auVar83._12_4_;
              auVar77 = vsubps_avx(local_560._0_16_,auVar198);
              auVar209 = ZEXT1664(auVar77);
              auVar33._8_4_ = 0x7fffffff;
              auVar33._0_8_ = 0x7fffffff7fffffff;
              auVar33._12_4_ = 0x7fffffff;
              auVar83 = vandps_avx512vl(local_580._0_16_,auVar33);
              auVar83 = vucomiss_avx512f(auVar83);
              auVar229 = ZEXT3264(local_5c0);
            } while ((bool)uVar59 || (bool)uVar60);
            auVar83 = vaddss_avx512f(auVar68,auVar83);
            auVar83 = vfmadd231ss_fma(auVar83,local_530,ZEXT416(0x36000000));
            auVar34._8_4_ = 0x7fffffff;
            auVar34._0_8_ = 0x7fffffff7fffffff;
            auVar34._12_4_ = 0x7fffffff;
            auVar79 = vandps_avx512vl(ZEXT416((uint)fVar161),auVar34);
          } while (auVar83._0_4_ <= auVar79._0_4_);
          fVar145 = auVar77._0_4_ + (float)local_540._0_4_;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar145) &&
             (fVar160 = (ray->super_RayK<1>).tfar, fVar145 <= fVar160)) {
            auVar77 = vmovshdup_avx(auVar77);
            fVar161 = auVar77._0_4_;
            if ((0.0 <= fVar161) && (fVar161 <= 1.0)) {
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5a0._0_4_));
              fVar162 = auVar77._0_4_;
              pGVar8 = (context->scene->geometries).items[local_8f0].ptr;
              if ((pGVar8->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar162 = fVar162 * 1.5 +
                          (float)local_5a0._0_4_ * -0.5 * fVar162 * fVar162 * fVar162;
                auVar199._0_4_ = fVar162 * (float)local_8e0._0_4_;
                auVar199._4_4_ = fVar162 * (float)local_8e0._4_4_;
                auVar199._8_4_ = fVar162 * fStack_8d8;
                auVar199._12_4_ = fVar162 * fStack_8d4;
                auVar85 = vfmadd213ps_fma(auVar85,auVar199,auVar78);
                auVar77 = vshufps_avx(auVar199,auVar199,0xc9);
                auVar83 = vshufps_avx(auVar78,auVar78,0xc9);
                auVar200._0_4_ = auVar199._0_4_ * auVar83._0_4_;
                auVar200._4_4_ = auVar199._4_4_ * auVar83._4_4_;
                auVar200._8_4_ = auVar199._8_4_ * auVar83._8_4_;
                auVar200._12_4_ = auVar199._12_4_ * auVar83._12_4_;
                auVar79 = vfmsub231ps_fma(auVar200,auVar78,auVar77);
                auVar77 = vshufps_avx(auVar79,auVar79,0xc9);
                auVar83 = vshufps_avx(auVar85,auVar85,0xc9);
                auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
                auVar139._0_4_ = auVar85._0_4_ * auVar79._0_4_;
                auVar139._4_4_ = auVar85._4_4_ * auVar79._4_4_;
                auVar139._8_4_ = auVar85._8_4_ * auVar79._8_4_;
                auVar139._12_4_ = auVar85._12_4_ * auVar79._12_4_;
                auVar83 = vfmsub231ps_fma(auVar139,auVar77,auVar83);
                auVar77 = vshufps_avx(auVar83,auVar83,0xe9);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar145;
                  uVar22 = vmovlps_avx(auVar77);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar22;
                  (ray->Ng).field_0.field_0.z = auVar83._0_4_;
                  ray->u = fVar161;
                  ray->v = 0.0;
                  ray->primID = (uint)local_8e8;
                  ray->geomID = (uint)local_8f0;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_8e0._0_4_ = fVar160;
                  local_680 = vmovlps_avx(auVar77);
                  local_678 = auVar83._0_4_;
                  local_674 = fVar161;
                  local_670 = 0;
                  local_66c = (uint)local_8e8;
                  local_668 = (uint)local_8f0;
                  local_664 = context->user->instID[0];
                  local_660 = context->user->instPrimID[0];
                  (ray->super_RayK<1>).tfar = fVar145;
                  local_8f4 = -1;
                  local_758.valid = &local_8f4;
                  local_758.geometryUserPtr = pGVar8->userPtr;
                  local_758.context = context->user;
                  local_758.ray = (RTCRayN *)ray;
                  local_758.hit = (RTCHitN *)&local_680;
                  local_758.N = 1;
                  if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01893c50:
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_758);
                      auVar252 = ZEXT3264(local_720);
                      auVar249 = ZEXT3264(local_8c0);
                      auVar247 = ZEXT3264(local_8a0);
                      auVar246 = ZEXT3264(local_880);
                      auVar245 = ZEXT3264(local_860);
                      auVar244 = ZEXT3264(local_840);
                      auVar243 = ZEXT3264(local_820);
                      auVar89 = vmovdqa64_avx512vl(local_800);
                      auVar242 = ZEXT3264(auVar89);
                      auVar241 = ZEXT3264(local_7e0);
                      auVar253 = ZEXT3264(local_7c0);
                      auVar239 = ZEXT3264(local_640);
                      auVar229 = ZEXT3264(local_5c0);
                      auVar236 = ZEXT3264(local_620);
                      auVar232 = ZEXT3264(local_600);
                      auVar250 = ZEXT3264(local_7a0);
                      auVar248 = ZEXT3264(local_6e0);
                      auVar251 = ZEXT3264(local_700);
                      if (*local_758.valid == 0) goto LAB_01893d7c;
                    }
                    (((Vec3f *)((long)local_758.ray + 0x30))->field_0).components[0] =
                         *(float *)local_758.hit;
                    (((Vec3f *)((long)local_758.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_758.hit + 4);
                    (((Vec3f *)((long)local_758.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_758.hit + 8);
                    *(float *)((long)local_758.ray + 0x3c) = *(float *)(local_758.hit + 0xc);
                    *(float *)((long)local_758.ray + 0x40) = *(float *)(local_758.hit + 0x10);
                    *(float *)((long)local_758.ray + 0x44) = *(float *)(local_758.hit + 0x14);
                    *(float *)((long)local_758.ray + 0x48) = *(float *)(local_758.hit + 0x18);
                    *(float *)((long)local_758.ray + 0x4c) = *(float *)(local_758.hit + 0x1c);
                    *(float *)((long)local_758.ray + 0x50) = *(float *)(local_758.hit + 0x20);
                  }
                  else {
                    (*pGVar8->intersectionFilterN)(&local_758);
                    auVar252 = ZEXT3264(local_720);
                    auVar249 = ZEXT3264(local_8c0);
                    auVar247 = ZEXT3264(local_8a0);
                    auVar246 = ZEXT3264(local_880);
                    auVar245 = ZEXT3264(local_860);
                    auVar244 = ZEXT3264(local_840);
                    auVar243 = ZEXT3264(local_820);
                    auVar89 = vmovdqa64_avx512vl(local_800);
                    auVar242 = ZEXT3264(auVar89);
                    auVar241 = ZEXT3264(local_7e0);
                    auVar253 = ZEXT3264(local_7c0);
                    auVar239 = ZEXT3264(local_640);
                    auVar229 = ZEXT3264(local_5c0);
                    auVar236 = ZEXT3264(local_620);
                    auVar232 = ZEXT3264(local_600);
                    auVar250 = ZEXT3264(local_7a0);
                    auVar248 = ZEXT3264(local_6e0);
                    auVar251 = ZEXT3264(local_700);
                    if (*local_758.valid != 0) goto LAB_01893c50;
LAB_01893d7c:
                    (ray->super_RayK<1>).tfar = (float)local_8e0._0_4_;
                  }
                }
              }
            }
          }
LAB_01893ac3:
          fVar160 = (ray->super_RayK<1>).tfar;
          auVar49._4_4_ = fStack_2fc;
          auVar49._0_4_ = local_300;
          auVar49._8_4_ = fStack_2f8;
          auVar49._12_4_ = fStack_2f4;
          auVar49._16_4_ = fStack_2f0;
          auVar49._20_4_ = fStack_2ec;
          auVar49._24_4_ = fStack_2e8;
          auVar49._28_4_ = fStack_2e4;
          fVar145 = (ray->super_RayK<1>).tfar;
          auVar39._4_4_ = fVar145;
          auVar39._0_4_ = fVar145;
          auVar39._8_4_ = fVar145;
          auVar39._12_4_ = fVar145;
          auVar39._16_4_ = fVar145;
          auVar39._20_4_ = fVar145;
          auVar39._24_4_ = fVar145;
          auVar39._28_4_ = fVar145;
          uVar22 = vcmpps_avx512vl(auVar49,auVar39,2);
        }
        uVar24 = vpcmpd_avx512vl(local_2c0,local_220,1);
        uVar23 = vpcmpd_avx512vl(local_2c0,_local_320,1);
        auVar184._0_4_ = (float)local_340._0_4_ + (float)local_2a0._0_4_;
        auVar184._4_4_ = (float)local_340._4_4_ + (float)local_2a0._4_4_;
        auVar184._8_4_ = fStack_338 + fStack_298;
        auVar184._12_4_ = fStack_334 + fStack_294;
        auVar184._16_4_ = fStack_330 + fStack_290;
        auVar184._20_4_ = fStack_32c + fStack_28c;
        auVar184._24_4_ = fStack_328 + fStack_288;
        auVar184._28_4_ = fStack_324 + fStack_284;
        auVar202._4_4_ = fVar160;
        auVar202._0_4_ = fVar160;
        auVar202._8_4_ = fVar160;
        auVar202._12_4_ = fVar160;
        auVar202._16_4_ = fVar160;
        auVar202._20_4_ = fVar160;
        auVar202._24_4_ = fVar160;
        auVar202._28_4_ = fVar160;
        uVar22 = vcmpps_avx512vl(auVar184,auVar202,2);
        bVar55 = (byte)local_724 & (byte)uVar24 & (byte)uVar22;
        auVar185._0_4_ = (float)local_340._0_4_ + (float)local_260._0_4_;
        auVar185._4_4_ = (float)local_340._4_4_ + (float)local_260._4_4_;
        auVar185._8_4_ = fStack_338 + fStack_258;
        auVar185._12_4_ = fStack_334 + fStack_254;
        auVar185._16_4_ = fStack_330 + fStack_250;
        auVar185._20_4_ = fStack_32c + fStack_24c;
        auVar185._24_4_ = fStack_328 + fStack_248;
        auVar185._28_4_ = fStack_324 + fStack_244;
        uVar22 = vcmpps_avx512vl(auVar185,auVar202,2);
        bVar50 = bVar50 & (byte)uVar23 & (byte)uVar22 | bVar55;
        if (bVar50 != 0) {
          uVar52 = (ulong)uVar54;
          abStack_180[uVar52 * 0x60] = bVar50;
          bVar58 = (bool)(bVar55 >> 1 & 1);
          bVar13 = (bool)(bVar55 >> 2 & 1);
          bVar14 = (bool)(bVar55 >> 3 & 1);
          bVar15 = (bool)(bVar55 >> 4 & 1);
          bVar16 = (bool)(bVar55 >> 5 & 1);
          bVar17 = (bool)(bVar55 >> 6 & 1);
          auStack_160[uVar52 * 0x18] =
               (uint)(bVar55 & 1) * local_2a0._0_4_ | (uint)!(bool)(bVar55 & 1) * local_260._0_4_;
          auStack_160[uVar52 * 0x18 + 1] =
               (uint)bVar58 * local_2a0._4_4_ | (uint)!bVar58 * local_260._4_4_;
          auStack_160[uVar52 * 0x18 + 2] =
               (uint)bVar13 * (int)fStack_298 | (uint)!bVar13 * (int)fStack_258;
          auStack_160[uVar52 * 0x18 + 3] =
               (uint)bVar14 * (int)fStack_294 | (uint)!bVar14 * (int)fStack_254;
          auStack_160[uVar52 * 0x18 + 4] =
               (uint)bVar15 * (int)fStack_290 | (uint)!bVar15 * (int)fStack_250;
          auStack_160[uVar52 * 0x18 + 5] =
               (uint)bVar16 * (int)fStack_28c | (uint)!bVar16 * (int)fStack_24c;
          auStack_160[uVar52 * 0x18 + 6] =
               (uint)bVar17 * (int)fStack_288 | (uint)!bVar17 * (int)fStack_248;
          auStack_160[uVar52 * 0x18 + 7] =
               (uint)(bVar55 >> 7) * (int)fStack_284 | (uint)!(bool)(bVar55 >> 7) * (int)fStack_244;
          uVar61 = vmovlps_avx(local_2d0);
          (&uStack_140)[uVar52 * 0xc] = uVar61;
          aiStack_138[uVar52 * 0x18] = local_904 + 1;
          uVar54 = uVar54 + 1;
        }
        auVar209 = ZEXT3264(local_4e0);
        prim = local_648;
      }
    }
    fVar160 = (ray->super_RayK<1>).tfar;
    fVar145 = (ray->super_RayK<1>).tfar;
    auVar155._4_4_ = fVar145;
    auVar155._0_4_ = fVar145;
    auVar155._8_4_ = fVar145;
    auVar155._12_4_ = fVar145;
    auVar155._16_4_ = fVar145;
    auVar155._20_4_ = fVar145;
    auVar155._24_4_ = fVar145;
    auVar155._28_4_ = fVar145;
    do {
      uVar62 = uVar54;
      uVar123 = uVar62 - 1;
      if (uVar62 == 0) {
        auVar140._4_4_ = fVar160;
        auVar140._0_4_ = fVar160;
        auVar140._8_4_ = fVar160;
        auVar140._12_4_ = fVar160;
        uVar22 = vcmpps_avx512vl(auVar140,local_2e0,0xd);
        uVar61 = (ulong)((uint)uVar22 & (uint)local_4e8 - 1 & (uint)local_4e8);
        goto LAB_018916e0;
      }
      uVar61 = (ulong)uVar123;
      auVar89 = *(undefined1 (*) [32])(auStack_160 + uVar61 * 0x18);
      auVar201._0_4_ = auVar89._0_4_ + (float)local_340._0_4_;
      auVar201._4_4_ = auVar89._4_4_ + (float)local_340._4_4_;
      auVar201._8_4_ = auVar89._8_4_ + fStack_338;
      auVar201._12_4_ = auVar89._12_4_ + fStack_334;
      auVar201._16_4_ = auVar89._16_4_ + fStack_330;
      auVar201._20_4_ = auVar89._20_4_ + fStack_32c;
      auVar201._24_4_ = auVar89._24_4_ + fStack_328;
      auVar201._28_4_ = auVar89._28_4_ + fStack_324;
      uVar22 = vcmpps_avx512vl(auVar201,auVar155,2);
      uVar124 = (uint)uVar22 & (uint)abStack_180[uVar61 * 0x60];
      uVar54 = uVar123;
    } while (uVar124 == 0);
    uVar52 = (&uStack_140)[uVar61 * 0xc];
    auVar133._8_8_ = 0;
    auVar133._0_8_ = uVar52;
    auVar156._8_4_ = 0x7f800000;
    auVar156._0_8_ = 0x7f8000007f800000;
    auVar156._12_4_ = 0x7f800000;
    auVar156._16_4_ = 0x7f800000;
    auVar156._20_4_ = 0x7f800000;
    auVar156._24_4_ = 0x7f800000;
    auVar156._28_4_ = 0x7f800000;
    auVar89 = vblendmps_avx512vl(auVar156,auVar89);
    bVar50 = (byte)uVar124;
    auVar120._0_4_ = (uint)(bVar50 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar50 & 1) * 0x7f800000;
    bVar58 = (bool)((byte)(uVar124 >> 1) & 1);
    auVar120._4_4_ = (uint)bVar58 * auVar89._4_4_ | (uint)!bVar58 * 0x7f800000;
    bVar58 = (bool)((byte)(uVar124 >> 2) & 1);
    auVar120._8_4_ = (uint)bVar58 * auVar89._8_4_ | (uint)!bVar58 * 0x7f800000;
    bVar58 = (bool)((byte)(uVar124 >> 3) & 1);
    auVar120._12_4_ = (uint)bVar58 * auVar89._12_4_ | (uint)!bVar58 * 0x7f800000;
    bVar58 = (bool)((byte)(uVar124 >> 4) & 1);
    auVar120._16_4_ = (uint)bVar58 * auVar89._16_4_ | (uint)!bVar58 * 0x7f800000;
    bVar58 = (bool)((byte)(uVar124 >> 5) & 1);
    auVar120._20_4_ = (uint)bVar58 * auVar89._20_4_ | (uint)!bVar58 * 0x7f800000;
    bVar58 = (bool)((byte)(uVar124 >> 6) & 1);
    auVar120._24_4_ = (uint)bVar58 * auVar89._24_4_ | (uint)!bVar58 * 0x7f800000;
    auVar120._28_4_ = (uVar124 >> 7) * auVar89._28_4_ | (uint)!SUB41(uVar124 >> 7,0) * 0x7f800000;
    auVar89 = vshufps_avx(auVar120,auVar120,0xb1);
    auVar89 = vminps_avx(auVar120,auVar89);
    auVar87 = vshufpd_avx(auVar89,auVar89,5);
    auVar89 = vminps_avx(auVar89,auVar87);
    auVar87 = vpermpd_avx2(auVar89,0x4e);
    auVar89 = vminps_avx(auVar89,auVar87);
    uVar22 = vcmpps_avx512vl(auVar120,auVar89,0);
    bVar55 = (byte)uVar22 & bVar50;
    if (bVar55 != 0) {
      uVar124 = (uint)bVar55;
    }
    uVar125 = 0;
    for (; (uVar124 & 1) == 0; uVar124 = uVar124 >> 1 | 0x80000000) {
      uVar125 = uVar125 + 1;
    }
    local_904 = aiStack_138[uVar61 * 0x18];
    bVar50 = ~('\x01' << ((byte)uVar125 & 0x1f)) & bVar50;
    abStack_180[uVar61 * 0x60] = bVar50;
    uVar54 = uVar62;
    if (bVar50 == 0) {
      uVar54 = uVar123;
    }
    uVar130 = (undefined4)uVar52;
    auVar157._4_4_ = uVar130;
    auVar157._0_4_ = uVar130;
    auVar157._8_4_ = uVar130;
    auVar157._12_4_ = uVar130;
    auVar157._16_4_ = uVar130;
    auVar157._20_4_ = uVar130;
    auVar157._24_4_ = uVar130;
    auVar157._28_4_ = uVar130;
    auVar77 = vmovshdup_avx(auVar133);
    auVar77 = vsubps_avx(auVar77,auVar133);
    auVar141._0_4_ = auVar77._0_4_;
    auVar141._4_4_ = auVar141._0_4_;
    auVar141._8_4_ = auVar141._0_4_;
    auVar141._12_4_ = auVar141._0_4_;
    auVar141._16_4_ = auVar141._0_4_;
    auVar141._20_4_ = auVar141._0_4_;
    auVar141._24_4_ = auVar141._0_4_;
    auVar141._28_4_ = auVar141._0_4_;
    auVar77 = vfmadd132ps_fma(auVar141,auVar157,_DAT_01f7b040);
    _local_2a0 = ZEXT1632(auVar77);
    local_2d0._8_8_ = 0;
    local_2d0._0_8_ = *(ulong *)(local_2a0 + (ulong)uVar125 * 4);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }